

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *atlas)

{
  ushort *puVar1;
  uint *puVar2;
  int *piVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  ImWchar IVar9;
  ImFont *pIVar10;
  stbtt_fontinfo *info;
  ImFontConfig *pIVar11;
  char cVar12;
  char cVar17;
  undefined1 auVar25 [15];
  undefined1 auVar26 [14];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [14];
  undefined1 auVar31 [16];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  stbtt__buf fontdict;
  undefined1 auVar36 [15];
  unkuint9 Var37;
  undefined1 auVar38 [15];
  undefined1 auVar39 [13];
  undefined1 auVar40 [14];
  undefined1 auVar41 [12];
  undefined1 auVar42 [16];
  undefined1 auVar43 [15];
  unkbyte10 Var44;
  uint6 uVar45;
  undefined1 auVar46 [14];
  undefined1 auVar47 [16];
  undefined1 auVar48 [12];
  undefined1 auVar49 [12];
  stbtt__active_edge **ppsVar50;
  ushort uVar51;
  short sVar52;
  stbtt_uint32 sVar53;
  stbtt_uint32 sVar58;
  uint uVar59;
  uint uVar60;
  int iVar61;
  int iVar62;
  stbtt__active_edge *z_1;
  stbtt_uint32 sVar54;
  stbtt_uint32 sVar55;
  stbtt_uint32 sVar56;
  stbtt_uint32 sVar57;
  void *pvVar63;
  int *piVar64;
  void *pvVar65;
  stbrp_context *ptr;
  uchar *puVar66;
  void *pvVar67;
  long lVar68;
  stbtt__buf *scanline;
  stbtt__active_edge *psVar69;
  undefined1 auVar70 [8];
  stbtt__buf *psVar71;
  undefined8 *puVar72;
  stbtt__active_edge *psVar73;
  uint uVar74;
  ImWchar *pIVar75;
  int mask;
  ulong uVar76;
  long lVar77;
  int iVar78;
  stbtt__active_edge *z;
  ulong uVar79;
  undefined8 *puVar80;
  long lVar81;
  ushort *puVar82;
  uchar uVar83;
  short sVar84;
  void *p;
  void *pvVar85;
  stbtt__edge *psVar86;
  ulong uVar87;
  uint *puVar88;
  stbrp_node **ppsVar89;
  byte *pbVar90;
  int iVar91;
  ImFontConfig *pIVar92;
  stbtt__edge *psVar93;
  int iVar94;
  int iVar95;
  uint uVar96;
  ulong uVar97;
  int bit_n;
  uint uVar98;
  long lVar99;
  stbtt_fontinfo *psVar100;
  byte *pbVar101;
  bool bVar102;
  byte bVar103;
  float fVar104;
  char cVar111;
  char cVar112;
  short sVar115;
  undefined1 auVar105 [16];
  char cVar114;
  ushort uVar113;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  float fVar116;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  float fVar133;
  float fVar134;
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  float fVar135;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  int iVar136;
  float fVar137;
  float fVar141;
  float fVar142;
  undefined1 auVar138 [16];
  uint uVar143;
  float fVar144;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  float fVar145;
  undefined4 uVar146;
  uint uVar153;
  float fVar154;
  uint uVar155;
  float fVar156;
  uint uVar157;
  float fVar158;
  undefined1 auVar151 [16];
  float fVar159;
  uint uVar163;
  float fVar164;
  uint uVar165;
  float fVar166;
  uint uVar167;
  float fVar168;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined4 uVar169;
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  stbtt__buf sVar185;
  float y0_2;
  int y1;
  stbtt_uint32 charstrings;
  stbtt_uint32 fdarrayoff;
  ImVector<stbrp_rect> buf_rects;
  ImVector<ImFontBuildSrcData> src_tmp_array;
  ImVector<ImFontBuildDstData> dst_tmp_array;
  ImVector<stbtt_packedchar> buf_packedchars;
  int y0_1;
  int x0_1;
  int iy0;
  int x1_1;
  int x0;
  undefined4 in_stack_fffffffffffffb18;
  undefined1 in_stack_fffffffffffffb1c [12];
  undefined4 in_stack_fffffffffffffb40;
  undefined4 in_stack_fffffffffffffb44;
  stbtt_uint32 local_478;
  stbtt_uint32 local_474;
  undefined1 local_470 [8];
  stbrp_node *local_468;
  stbtt__edge *local_460;
  ulong local_458;
  undefined8 local_450;
  undefined1 local_448 [16];
  undefined1 local_438 [16];
  void *local_428;
  ulong local_420;
  undefined8 local_418;
  int local_410;
  float local_40c;
  undefined1 local_408 [8];
  void *pvStack_400;
  long local_3f8;
  void *pvStack_3f0;
  ulong local_3e0;
  ulong local_3d8;
  int local_3d0;
  float local_3cc;
  long local_3c8;
  void *pvStack_3c0;
  stbtt_fontinfo *local_3b8;
  stbtt__active_edge *local_3b0;
  long local_3a8;
  void *pvStack_3a0;
  ulong local_398;
  undefined4 uStack_390;
  undefined4 uStack_38c;
  uchar *local_388;
  undefined8 *local_380;
  ulong local_378;
  long local_370;
  long local_368;
  float *local_360;
  uint local_358;
  uint local_354;
  float local_350;
  int local_34c;
  int local_348;
  int local_344;
  stbrp_context *local_340;
  long local_338;
  float *local_330;
  ulong local_328;
  ulong local_320;
  undefined1 local_318 [16];
  ImFontConfig *local_300;
  long local_2f8;
  size_t local_2f0;
  size_t local_2e8;
  uchar *local_2e0;
  ulong local_2d8;
  long local_2d0;
  short *local_2c8;
  int local_2c0;
  int local_2bc;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [8];
  float fStack_240;
  float fStack_23c;
  stbtt__buf local_238 [32];
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined6 uVar147;
  undefined8 uVar148;
  undefined1 auVar149 [12];
  undefined1 auVar150 [14];
  undefined1 auVar152 [16];
  undefined6 uVar170;
  undefined8 uVar171;
  undefined1 auVar172 [12];
  undefined1 auVar173 [14];
  undefined1 auVar178 [16];
  
  ImFontAtlasBuildRegisterDefaultCustomRects(atlas);
  atlas->TexID = (ImTextureID)0x0;
  atlas->TexWidth = 0;
  atlas->TexHeight = 0;
  (atlas->TexUvScale).x = 0.0;
  (atlas->TexUvScale).y = 0.0;
  (atlas->TexUvWhitePixel).x = 0.0;
  (atlas->TexUvWhitePixel).y = 0.0;
  ImFontAtlas::ClearTexData(atlas);
  local_3f8 = 0;
  pvStack_3f0 = (void *)0x0;
  local_3c8 = 0;
  pvStack_3c0 = (void *)0x0;
  uVar59 = (atlas->ConfigData).Size;
  uVar97 = (ulong)(int)uVar59;
  if (0 < (long)uVar97) {
    uVar79 = 8;
    if (8 < uVar59) {
      uVar79 = (ulong)uVar59;
    }
    pvStack_3f0 = ImGui::MemAlloc(uVar79 * 0x110);
    local_3f8 = uVar79 << 0x20;
  }
  pvVar67 = pvStack_3f0;
  local_3f8 = CONCAT44(local_3f8._4_4_,uVar59);
  uVar59 = (atlas->Fonts).Size;
  if ((long)(int)uVar59 < 1) {
    pvVar63 = (void *)0x0;
  }
  else {
    uVar79 = 8;
    if (8 < uVar59) {
      uVar79 = (ulong)uVar59;
    }
    pvVar63 = ImGui::MemAlloc(uVar79 << 5);
    local_3c8 = uVar79 << 0x20;
    pvStack_3c0 = pvVar63;
  }
  local_3c8 = CONCAT44(local_3c8._4_4_,uVar59);
  uVar60 = 0;
  memset(pvVar67,0,uVar97 * 0x110);
  memset(pvVar63,0,(long)(int)uVar59 << 5);
  if (0 < (atlas->ConfigData).Size) {
    lVar99 = 0;
    do {
      pIVar92 = (atlas->ConfigData).Data + lVar99;
      lVar81 = lVar99 * 0x110;
      *(undefined4 *)((long)pvVar67 + lVar81 + 0xe0) = 0xffffffff;
      uVar79 = (ulong)(atlas->Fonts).Size;
      if ((long)uVar79 < 1) {
LAB_0013ae27:
        bVar102 = false;
        goto LAB_0013adef;
      }
      uVar76 = 0;
      while (pIVar10 = (atlas->Fonts).Data[uVar76], pIVar92->DstFont != pIVar10) {
        uVar76 = uVar76 + 1;
        bVar102 = false;
        if ((uVar79 <= uVar76) || (pIVar92->DstFont == pIVar10)) goto LAB_0013adef;
      }
      *(int *)((long)pvVar67 + lVar81 + 0xe0) = (int)uVar76;
      pbVar101 = (byte *)pIVar92->FontData;
      iVar78 = pIVar92->FontNo;
      bVar103 = *pbVar101;
      sVar58 = 0xffffffff;
      local_448._0_8_ = lVar99;
      local_438._0_8_ = uVar97;
      if (bVar103 < 0x4f) {
        if (bVar103 == 0) {
          if (pbVar101[1] == 1) goto LAB_00137bd2;
        }
        else if ((bVar103 == 0x31) && (pbVar101[1] == 0)) {
LAB_00137bd2:
          if ((pbVar101[2] == 0) && (pbVar101[3] == 0)) {
LAB_00137c3e:
            sVar58 = -(uint)(iVar78 != 0);
          }
        }
      }
      else if (bVar103 == 0x4f) {
        if (((pbVar101[1] == 0x54) && (pbVar101[2] == 0x54)) && (pbVar101[3] == 0x4f))
        goto LAB_00137c3e;
      }
      else if (bVar103 == 0x74) {
        bVar103 = pbVar101[1];
        if (bVar103 == 0x72) {
          if ((pbVar101[2] == 0x75) && (pbVar101[3] == 0x65)) goto LAB_00137c3e;
        }
        else if (bVar103 == 0x74) {
          if ((pbVar101[2] == 99) && (pbVar101[3] == 0x66)) {
            uVar59 = *(uint *)(pbVar101 + 4);
            uVar59 = uVar59 >> 0x18 | (uVar59 & 0xff0000) >> 8 | (uVar59 & 0xff00) << 8 |
                     uVar59 << 0x18;
            if (((uVar59 == 0x20000) || (uVar59 == 0x10000)) &&
               (uVar59 = *(uint *)(pbVar101 + 8),
               iVar78 < (int)(uVar59 >> 0x18 | (uVar59 & 0xff0000) >> 8 | (uVar59 & 0xff00) << 8 |
                             uVar59 << 0x18))) {
              uVar59 = *(uint *)(pbVar101 + (long)iVar78 * 4 + 0xc);
              sVar58 = uVar59 >> 0x18 | (uVar59 & 0xff0000) >> 8 | (uVar59 & 0xff00) << 8 |
                       uVar59 << 0x18;
            }
          }
        }
        else if (((bVar103 == 0x79) && (pbVar101[2] == 0x70)) && (pbVar101[3] == 0x31))
        goto LAB_00137c3e;
      }
      *(byte **)((long)pvVar67 + lVar81 + 8) = pbVar101;
      *(stbtt_uint32 *)((long)pvVar67 + lVar81 + 0x10) = sVar58;
      *(undefined8 *)((long)pvVar67 + lVar81 + 0x40) = 0;
      *(undefined8 *)((long)pvVar67 + lVar81 + 0x48) = 0;
      sVar53 = stbtt__find_table(pbVar101,sVar58,"cmap");
      local_474 = stbtt__find_table(pbVar101,sVar58,"loca");
      *(stbtt_uint32 *)((long)pvVar67 + lVar81 + 0x18) = local_474;
      sVar54 = stbtt__find_table(pbVar101,sVar58,"head");
      *(stbtt_uint32 *)((long)pvVar67 + lVar81 + 0x1c) = sVar54;
      sVar55 = stbtt__find_table(pbVar101,sVar58,"glyf");
      local_398 = CONCAT44(local_398._4_4_,sVar55);
      *(stbtt_uint32 *)((long)pvVar67 + lVar81 + 0x20) = sVar55;
      sVar55 = stbtt__find_table(pbVar101,sVar58,"hhea");
      *(stbtt_uint32 *)((long)pvVar67 + lVar81 + 0x24) = sVar55;
      sVar56 = stbtt__find_table(pbVar101,sVar58,"hmtx");
      *(stbtt_uint32 *)((long)pvVar67 + lVar81 + 0x28) = sVar56;
      sVar57 = stbtt__find_table(pbVar101,sVar58,"kern");
      *(stbtt_uint32 *)((long)pvVar67 + lVar81 + 0x2c) = sVar57;
      sVar57 = stbtt__find_table(pbVar101,sVar58,"GPOS");
      *(stbtt_uint32 *)((long)pvVar67 + lVar81 + 0x30) = sVar57;
      bVar102 = false;
      if (((sVar53 == 0) || (sVar54 == 0)) || (sVar55 == 0)) goto LAB_0013adef;
      uVar97 = local_438._0_8_;
      if (sVar56 == 0) goto LAB_0013adef;
      local_450 = CONCAT44(local_450._4_4_,sVar54);
      if ((float)local_398 == 0.0) {
        local_3a8 = CONCAT44(local_3a8._4_4_,2);
        local_470 = (undefined1  [8])((ulong)local_470 & 0xffffffff00000000);
        local_418._0_4_ = 0;
        uVar60 = 0;
        iVar78 = 0;
        local_478 = 0;
        sVar54 = stbtt__find_table(pbVar101,sVar58,"CFF ");
        if (sVar54 != 0) {
          *(undefined8 *)((long)pvVar67 + lVar81 + 0x90) = 0;
          *(undefined8 *)((long)pvVar67 + lVar81 + 0x98) = 0;
          *(undefined8 *)((long)pvVar67 + lVar81 + 0x80) = 0;
          *(undefined8 *)((long)pvVar67 + lVar81 + 0x88) = 0;
          *(byte **)((long)pvVar67 + lVar81 + 0x40) = pbVar101 + sVar54;
          *(undefined8 *)((long)pvVar67 + lVar81 + 0x48) = 0x2000000000000000;
          local_238[0].data = *(uchar **)((long)pvVar67 + lVar81 + 0x40);
          uVar148 = *(undefined8 *)((long)pvVar67 + lVar81 + 0x48);
          local_238[0].cursor = (int)uVar148;
          local_238[0].size = (int)((ulong)uVar148 >> 0x20);
          uVar59 = local_238[0].cursor + 2U;
          if (local_238[0].size < (int)(local_238[0].cursor + 2U)) {
            uVar59 = local_238[0].size;
          }
          if (local_238[0].cursor < -2) {
            uVar59 = local_238[0].size;
          }
          local_238[0].cursor = 0;
          if ((int)uVar59 < local_238[0].size) {
            local_238[0].cursor = (int)local_238[0].data[(int)uVar59];
          }
          if (local_238[0].size < local_238[0].cursor) {
            local_238[0].cursor = local_238[0].size;
          }
          stbtt__cff_get_index(local_238);
          sVar185 = stbtt__cff_get_index(local_238);
          _local_408 = stbtt__cff_index_get(sVar185,0);
          stbtt__cff_get_index(local_238);
          sVar185 = stbtt__cff_get_index(local_238);
          *(stbtt__buf *)((long)pvVar67 + lVar81 + 0x60) = sVar185;
          stbtt__dict_get_ints((stbtt__buf *)local_408,0x11,1,(stbtt_uint32 *)local_470);
          stbtt__dict_get_ints((stbtt__buf *)local_408,0x106,1,(stbtt_uint32 *)&local_3a8);
          stbtt__dict_get_ints((stbtt__buf *)local_408,0x124,1,(stbtt_uint32 *)&local_418);
          stbtt__dict_get_ints((stbtt__buf *)local_408,0x125,1,&local_478);
          uVar148 = local_238[0]._8_8_;
          sVar185._4_12_ = in_stack_fffffffffffffb1c;
          sVar185.data._0_4_ = in_stack_fffffffffffffb18;
          fontdict.data._4_4_ = in_stack_fffffffffffffb44;
          fontdict.data._0_4_ = in_stack_fffffffffffffb40;
          fontdict.cursor = uVar60;
          fontdict.size = iVar78;
          sVar185 = stbtt__get_subrs(sVar185,fontdict);
          sVar54 = local_478;
          *(stbtt__buf *)((long)pvVar67 + lVar81 + 0x70) = sVar185;
          if (((stbtt_uint32)local_3a8 == 2) && (uVar146 = local_470._0_4_, local_470._0_4_ != 0)) {
            sVar55 = SUB84(uVar148,4);
            if ((stbtt_uint32)local_418 != 0) {
              uVar79 = (ulong)local_478;
              if (uVar79 == 0) goto LAB_0013ae27;
              sVar56 = (stbtt_uint32)local_418;
              if ((int)sVar55 < (int)(stbtt_uint32)local_418) {
                sVar56 = sVar55;
              }
              if ((int)(stbtt_uint32)local_418 < 0) {
                sVar56 = sVar55;
              }
              local_238[0].cursor = sVar56;
              sVar185 = stbtt__cff_get_index(local_238);
              *(stbtt__buf *)((long)pvVar67 + lVar81 + 0x80) = sVar185;
              bVar102 = (int)(local_238[0].size - sVar54 | sVar54) < 0;
              puVar66 = local_238[0].data + uVar79;
              lVar99 = (ulong)(local_238[0].size - sVar54) << 0x20;
              if (bVar102 || local_238[0].size < (int)sVar54) {
                puVar66 = (uchar *)0x0;
              }
              uVar60 = 0;
              if (bVar102 || local_238[0].size < (int)sVar54) {
                lVar99 = 0;
              }
              *(uchar **)((long)pvVar67 + lVar81 + 0x90) = puVar66;
              *(long *)((long)pvVar67 + lVar81 + 0x98) = lVar99;
              sVar55 = local_238[0].size;
            }
            sVar54 = uVar146;
            if ((int)sVar55 < (int)uVar146) {
              sVar54 = sVar55;
            }
            if ((int)uVar146 < 0) {
              sVar54 = sVar55;
            }
            local_238[0].cursor = sVar54;
            sVar185 = stbtt__cff_get_index(local_238);
            *(stbtt__buf *)((long)pvVar67 + lVar81 + 0x50) = sVar185;
            lVar99 = local_448._0_8_;
            goto LAB_0013800c;
          }
        }
        goto LAB_0013ae27;
      }
      lVar99 = local_448._0_8_;
      if (local_474 == 0) goto LAB_0013ae27;
LAB_0013800c:
      sVar58 = stbtt__find_table(pbVar101,sVar58,"maxp");
      if (sVar58 == 0) {
        uVar59 = 0xffff;
      }
      else {
        uVar59 = (uint)(ushort)(*(ushort *)(pbVar101 + (ulong)sVar58 + 4) << 8 |
                               *(ushort *)(pbVar101 + (ulong)sVar58 + 4) >> 8);
      }
      *(uint *)((long)pvVar67 + lVar81 + 0x14) = uVar59;
      uVar51 = *(ushort *)(pbVar101 + (ulong)sVar53 + 2) << 8 |
               *(ushort *)(pbVar101 + (ulong)sVar53 + 2) >> 8;
      *(undefined4 *)((long)pvVar67 + lVar81 + 0x34) = 0;
      iVar78 = 0;
      bVar102 = false;
      if (uVar51 == 0) goto LAB_0013adef;
      uVar59 = sVar53 + 4;
      uVar79 = (ulong)uVar51;
      do {
        uVar51 = *(ushort *)(pbVar101 + uVar59) << 8 | *(ushort *)(pbVar101 + uVar59) >> 8;
        if ((uVar51 == 0) ||
           ((uVar51 == 3 &&
            ((uVar51 = *(ushort *)(pbVar101 + (ulong)uVar59 + 2) << 8 |
                       *(ushort *)(pbVar101 + (ulong)uVar59 + 2) >> 8, uVar51 == 10 || (uVar51 == 1)
             ))))) {
          uVar98 = *(uint *)(pbVar101 + (ulong)uVar59 + 4);
          iVar78 = (uVar98 >> 0x18 | (uVar98 & 0xff0000) >> 8 | (uVar98 & 0xff00) << 8 |
                   uVar98 << 0x18) + sVar53;
          *(int *)((long)pvVar67 + lVar81 + 0x34) = iVar78;
        }
        uVar59 = uVar59 + 8;
        uVar79 = uVar79 - 1;
      } while (uVar79 != 0);
      if (iVar78 == 0) goto LAB_0013ae27;
      *(uint *)((long)pvVar67 + lVar81 + 0x38) =
           (uint)(ushort)(*(ushort *)(pbVar101 + (long)(int)(float)local_450 + 0x32) << 8 |
                         *(ushort *)(pbVar101 + (long)(int)(float)local_450 + 0x32) >> 8);
      pIVar75 = pIVar92->GlyphRanges;
      if (pIVar75 == (ImWchar *)0x0) {
        pIVar75 = ImFontAtlas::GetGlyphRangesDefault::ranges;
      }
      *(ImWchar **)((long)pvVar67 + lVar81 + 0xd8) = pIVar75;
      IVar9 = *pIVar75;
      while (IVar9 != 0) {
        uVar51 = pIVar75[1];
        if (uVar51 == 0) break;
        uVar59 = *(uint *)((long)pvVar67 + lVar81 + 0xe4);
        uVar98 = (uint)uVar51;
        if ((int)(uint)uVar51 < (int)uVar59) {
          uVar98 = uVar59;
        }
        *(uint *)((long)pvVar67 + lVar81 + 0xe4) = uVar98;
        IVar9 = pIVar75[2];
        pIVar75 = pIVar75 + 2;
      }
      piVar64 = (int *)((long)*(int *)((long)pvVar67 + lVar81 + 0xe0) * 0x20 + (long)pvVar63);
      *piVar64 = *piVar64 + 1;
      iVar78 = *(int *)((long)pvVar67 + lVar81 + 0xe4);
      if (iVar78 < piVar64[1]) {
        iVar78 = piVar64[1];
      }
      piVar64[1] = iVar78;
      lVar99 = lVar99 + 1;
    } while (lVar99 < (atlas->ConfigData).Size);
  }
  if ((int)uVar97 < 1) {
    local_450 = 0;
  }
  else {
    lVar99 = 0;
    uVar60 = 0;
    do {
      lVar81 = lVar99 * 0x110;
      piVar64 = (int *)((long)*(int *)((long)pvVar67 + lVar81 + 0xe0) * 0x20 + (long)pvStack_3c0);
      pIVar92 = (atlas->ConfigData).Data;
      ImBoolVector::Resize
                ((ImBoolVector *)((long)pvVar67 + lVar81 + 0xf0),
                 *(int *)((long)pvVar67 + lVar81 + 0xe4) + 1);
      if ((1 < *piVar64) && (piVar64[4] == 0)) {
        ImBoolVector::Resize((ImBoolVector *)(piVar64 + 4),piVar64[1] + 1);
      }
      puVar82 = *(ushort **)((long)pvVar67 + lVar81 + 0xd8);
      uVar79 = (ulong)*puVar82;
      if (*puVar82 != 0) {
        do {
          uVar51 = puVar82[1];
          if (uVar51 == 0) break;
          if ((ushort)uVar79 <= uVar51) {
            bVar102 = pIVar92[lVar99].MergeMode;
            do {
              if (((bVar102 == false) ||
                  ((*(uint *)(*(long *)(piVar64 + 6) + (uVar79 >> 5) * 4) >> ((uint)uVar79 & 0x1f) &
                   1) == 0)) &&
                 (iVar78 = stbtt_FindGlyphIndex
                                     (*(stbtt_fontinfo **)((long)pvVar67 + lVar81 + 8),
                                      *(int *)((long)pvVar67 + lVar81 + 0x34)), iVar78 != 0)) {
                piVar3 = (int *)((long)pvVar67 + lVar81 + 0xe8);
                *piVar3 = *piVar3 + 1;
                piVar64[2] = piVar64[2] + 1;
                uVar59 = 1 << ((byte)uVar79 & 0x1f);
                puVar88 = (uint *)(*(long *)((long)pvVar67 + lVar81 + 0xf8) + (uVar79 >> 5) * 4);
                *puVar88 = *puVar88 | uVar59;
                if (1 < *piVar64) {
                  puVar88 = (uint *)(*(long *)(piVar64 + 6) + (uVar79 >> 5) * 4);
                  *puVar88 = *puVar88 | uVar59;
                }
                uVar60 = uVar60 + 1;
              }
              uVar59 = (uint)uVar79 + 1;
              uVar79 = (ulong)uVar59;
            } while (uVar51 + 1 != uVar59);
          }
          puVar1 = puVar82 + 2;
          uVar79 = (ulong)*puVar1;
          puVar82 = puVar82 + 2;
        } while (*puVar1 != 0);
      }
      lVar99 = lVar99 + 1;
      uVar97 = (ulong)(int)local_3f8;
    } while (lVar99 < (long)uVar97);
    local_450 = CONCAT71((int7)(uVar79 >> 8),0 < (int)local_3f8);
    if ((int)local_3f8 < 1) {
      local_450 = 0;
    }
    else {
      uVar79 = 0;
      do {
        lVar99 = uVar79 * 0x110;
        iVar78 = *(int *)((long)pvVar67 + lVar99 + 0xe8);
        if (*(int *)((long)pvVar67 + lVar99 + 0x104) < iVar78) {
          pvVar65 = ImGui::MemAlloc((long)iVar78 << 2);
          pvVar63 = *(void **)((long)pvVar67 + lVar99 + 0x108);
          if (pvVar63 != (void *)0x0) {
            memcpy(pvVar65,pvVar63,(long)*(int *)((long)pvVar67 + lVar99 + 0x100) << 2);
            ImGui::MemFree(*(void **)((long)pvVar67 + lVar99 + 0x108));
          }
          *(void **)((long)pvVar67 + lVar99 + 0x108) = pvVar65;
          *(int *)((long)pvVar67 + lVar99 + 0x104) = iVar78;
        }
        lVar81 = (long)*(int *)((long)pvVar67 + lVar99 + 0xf0);
        puVar88 = *(uint **)((long)pvVar67 + lVar99 + 0xf8);
        if (0 < lVar81) {
          local_448._0_8_ = uVar79;
          local_438._0_8_ = uVar97;
          puVar2 = puVar88 + lVar81;
          iVar78 = 0;
          do {
            uVar59 = *puVar88;
            if (uVar59 != 0) {
              uVar98 = 0;
              do {
                if ((uVar59 >> (uVar98 & 0x1f) & 1) != 0) {
                  iVar91 = *(int *)((long)pvVar67 + lVar99 + 0x100);
                  if (iVar91 == *(int *)((long)pvVar67 + lVar99 + 0x104)) {
                    if (iVar91 == 0) {
                      iVar61 = 8;
                    }
                    else {
                      iVar61 = iVar91 / 2 + iVar91;
                    }
                    iVar62 = iVar91 + 1;
                    if (iVar91 + 1 < iVar61) {
                      iVar62 = iVar61;
                    }
                    pvVar63 = ImGui::MemAlloc((long)iVar62 << 2);
                    pvVar65 = *(void **)((long)pvVar67 + lVar99 + 0x108);
                    if (pvVar65 != (void *)0x0) {
                      memcpy(pvVar63,pvVar65,(long)*(int *)((long)pvVar67 + lVar99 + 0x100) << 2);
                      ImGui::MemFree(*(void **)((long)pvVar67 + lVar99 + 0x108));
                    }
                    *(void **)((long)pvVar67 + lVar99 + 0x108) = pvVar63;
                    *(int *)((long)pvVar67 + lVar99 + 0x104) = iVar62;
                    iVar91 = *(int *)((long)pvVar67 + lVar99 + 0x100);
                  }
                  else {
                    pvVar63 = *(void **)((long)pvVar67 + lVar99 + 0x108);
                  }
                  *(uint *)((long)pvVar63 + (long)iVar91 * 4) = iVar78 + uVar98;
                  piVar64 = (int *)((long)pvVar67 + lVar99 + 0x100);
                  *piVar64 = *piVar64 + 1;
                }
                uVar98 = uVar98 + 1;
              } while (uVar98 != 0x20);
            }
            puVar88 = puVar88 + 1;
            iVar78 = iVar78 + 0x20;
          } while (puVar88 < puVar2);
          puVar88 = *(uint **)((long)pvVar67 + lVar99 + 0xf8);
          uVar97 = local_438._0_8_;
          uVar79 = local_448._0_8_;
        }
        if (puVar88 != (uint *)0x0) {
          *(undefined8 *)((long)pvVar67 + lVar99 + 0xf0) = 0;
          ImGui::MemFree(puVar88);
          *(undefined8 *)((long)pvVar67 + lVar99 + 0xf8) = 0;
        }
        uVar79 = uVar79 + 1;
      } while (uVar79 < uVar97);
    }
  }
  pvVar63 = pvStack_3c0;
  local_438._0_8_ = uVar97;
  uVar97 = (ulong)(int)local_3c8;
  if ((long)uVar97 < 1) {
    if (pvStack_3c0 == (void *)0x0) goto LAB_00138511;
  }
  else {
    puVar80 = (undefined8 *)((long)pvStack_3c0 + 0x18);
    uVar79 = 0;
    do {
      if ((void *)*puVar80 != (void *)0x0) {
        puVar80[-1] = 0;
        ImGui::MemFree((void *)*puVar80);
        *puVar80 = 0;
      }
      uVar79 = uVar79 + 1;
      puVar80 = puVar80 + 4;
    } while (uVar79 < uVar97);
  }
  local_3c8 = 0;
  ImGui::MemFree(pvVar63);
  pvStack_3c0 = (void *)0x0;
LAB_00138511:
  _local_408 = (stbtt__buf)ZEXT816(0);
  local_3a8 = 0;
  pvStack_3a0 = (void *)0x0;
  if ((int)uVar60 < 1) {
    local_408._0_4_ = uVar60;
    pvVar63 = (void *)0x0;
  }
  else {
    uVar97 = 8;
    if (8 < uVar60) {
      uVar97 = (ulong)uVar60;
    }
    pvVar63 = ImGui::MemAlloc(uVar97 << 4);
    pvStack_400 = pvVar63;
    local_408._4_4_ = (int)uVar97;
    uVar97 = 8;
    if (8 < uVar60) {
      uVar97 = (ulong)uVar60;
    }
    local_408._0_4_ = uVar60;
    pvStack_3a0 = ImGui::MemAlloc(uVar97 * 0x1c);
    local_3a8 = uVar97 << 0x20;
  }
  pvVar65 = pvStack_3a0;
  local_3a8 = CONCAT44(local_3a8._4_4_,uVar60);
  iVar78 = 0;
  memset(pvVar63,0,(long)(int)(uVar60 << 4));
  memset(pvVar65,0,(long)(int)(uVar60 * 0x1c));
  fVar116 = 0.0;
  if ((char)local_450 != '\0') {
    uVar97 = (ulong)(uint)local_438._0_4_;
    uVar79 = 0;
    iVar91 = 0;
    iVar61 = 0;
    local_398 = uVar97;
    do {
      iVar62 = *(int *)((long)pvVar67 + uVar79 * 0x110 + 0xe8);
      if (iVar62 != 0) {
        psVar100 = (stbtt_fontinfo *)(uVar79 * 0x110 + (long)pvVar67);
        *(void **)&psVar100[1].hmtx = (void *)((long)iVar91 * 0x10 + (long)pvVar63);
        pvVar85 = (void *)((long)iVar61 * 0x1c + (long)pvVar65);
        *(void **)&psVar100[1].gpos = pvVar85;
        pIVar92 = (atlas->ConfigData).Data;
        fVar116 = pIVar92[uVar79].SizePixels;
        *(float *)&psVar100[1].userdata = fVar116;
        *(undefined4 *)((long)&psVar100[1].userdata + 4) = 0;
        psVar100[1].data = *(uchar **)&psVar100[1].gsubrs.cursor;
        iVar136 = *(int *)&psVar100[1].gsubrs.data;
        psVar100[1].fontstart = iVar136;
        *(void **)&psVar100[1].loca = pvVar85;
        *(char *)&psVar100[1].glyf = (char)pIVar92[uVar79].OversampleH;
        *(char *)((long)&psVar100[1].glyf + 1) = (char)pIVar92[uVar79].OversampleV;
        if (fVar116 <= 0.0) {
          fVar116 = -fVar116;
          uVar59 = (uint)(ushort)(*(ushort *)(psVar100->data + (long)psVar100->head + 0x12) << 8 |
                                 *(ushort *)(psVar100->data + (long)psVar100->head + 0x12) >> 8);
        }
        else {
          puVar66 = psVar100->data;
          lVar99 = (long)psVar100->hhea;
          uVar59 = ((int)(short)((ushort)puVar66[lVar99 + 4] << 8) | (uint)puVar66[lVar99 + 5]) -
                   ((int)(short)((ushort)puVar66[lVar99 + 6] << 8) | (uint)puVar66[lVar99 + 7]);
        }
        fVar116 = fVar116 / (float)(int)uVar59;
        iVar91 = iVar91 + iVar62;
        iVar61 = iVar61 + iVar62;
        if (0 < iVar136) {
          local_448._0_4_ = iVar91;
          iVar91 = atlas->TexGlyphPadding;
          lVar99 = 6;
          lVar81 = 0;
          do {
            iVar62 = stbtt_FindGlyphIndex((stbtt_fontinfo *)psVar100->data,psVar100->index_map);
            stbtt_GetGlyphBitmapBoxSubpixel
                      (psVar100,iVar62,(float)pIVar92[uVar79].OversampleH * fVar116,
                       (float)pIVar92[uVar79].OversampleV * fVar116,fVar116,in_XMM3._0_4_,
                       (int *)local_238,(int *)local_470,(int *)&local_418,(int *)&local_478);
            uVar59 = (pIVar92[uVar79].OversampleH +
                     (((stbtt_uint32)local_418 + iVar91) - (int)local_238[0].data)) - 1;
            lVar77 = *(long *)&psVar100[1].hmtx;
            *(short *)(lVar77 + -2 + lVar99) = (short)uVar59;
            uVar60 = (pIVar92[uVar79].OversampleV + ((local_478 + iVar91) - local_470._0_4_)) - 1;
            *(short *)(lVar77 + lVar99) = (short)uVar60;
            iVar78 = iVar78 + (uVar60 & 0xffff) * (uVar59 & 0xffff);
            lVar81 = lVar81 + 1;
            lVar99 = lVar99 + 0x10;
          } while (lVar81 < *(int *)&psVar100[1].gsubrs.data);
          uVar97 = local_398;
          iVar91 = local_448._0_4_;
        }
      }
      uVar79 = uVar79 + 1;
    } while (uVar79 < uVar97);
    fVar116 = (float)iVar78;
  }
  atlas->TexHeight = 0;
  iVar78 = atlas->TexDesiredWidth;
  if (iVar78 < 1) {
    iVar91 = (int)SQRT(fVar116);
    iVar78 = 0x1000;
    if ((iVar91 < 0xb33) && (iVar78 = 0x800, iVar91 < 0x599)) {
      iVar78 = (uint)(0x2cb < iVar91) * 0x200 + 0x200;
    }
  }
  atlas->TexWidth = iVar78;
  uVar59 = atlas->TexGlyphPadding;
  ptr = (stbrp_context *)ImGui::MemAlloc(0x48);
  uVar148 = local_438._0_8_;
  uVar60 = iVar78 - uVar59;
  local_468 = (stbrp_node *)ImGui::MemAlloc((long)(int)uVar60 << 4);
  auVar126 = _DAT_001942c0;
  auVar117 = _DAT_00192020;
  if ((ptr == (stbrp_context *)0x0) || (local_468 == (stbrp_node *)0x0)) {
    if (ptr != (stbrp_context *)0x0) {
      ImGui::MemFree(ptr);
    }
    if (local_468 != (stbrp_node *)0x0) {
      ImGui::MemFree(local_468);
    }
    local_468 = (stbrp_node *)0x0;
    uVar59 = 0;
    iVar78 = 0;
    ptr = (stbrp_context *)0x0;
  }
  else {
    if ((int)uVar60 < 2) {
      uVar97 = 0;
    }
    else {
      uVar97 = (ulong)(uVar60 - 1);
      uVar79 = (ulong)(uVar60 & 0x7ffffffe);
      lVar99 = uVar97 - 1;
      auVar105._8_4_ = (int)lVar99;
      auVar105._0_8_ = lVar99;
      auVar105._12_4_ = (int)((ulong)lVar99 >> 0x20);
      ppsVar89 = &local_468[1].next;
      auVar105 = auVar105 ^ _DAT_00192020;
      auVar174._8_4_ = 0xffffffff;
      auVar174._0_8_ = 0xffffffffffffffff;
      auVar174._12_4_ = 0xffffffff;
      auVar119 = _DAT_001920b0;
      do {
        auVar128 = auVar119 ^ auVar117;
        auVar138._0_4_ = -(uint)(auVar105._0_4_ < auVar128._0_4_);
        auVar138._4_4_ = -(uint)(auVar105._4_4_ < auVar128._4_4_);
        auVar138._8_4_ = -(uint)(auVar105._8_4_ < auVar128._8_4_);
        auVar138._12_4_ = -(uint)(auVar105._12_4_ < auVar128._12_4_);
        auVar129._4_4_ = -(uint)(auVar128._4_4_ == auVar105._4_4_);
        auVar129._12_4_ = -(uint)(auVar128._12_4_ == auVar105._12_4_);
        auVar129._0_4_ = auVar129._4_4_;
        auVar129._8_4_ = auVar129._12_4_;
        auVar128._4_4_ = auVar138._4_4_;
        auVar128._0_4_ = auVar138._4_4_;
        auVar128._8_4_ = auVar138._12_4_;
        auVar128._12_4_ = auVar138._12_4_;
        auVar128 = auVar128 | auVar129 & auVar138;
        lVar99 = auVar119._8_8_;
        if ((~auVar128._0_4_ & 1) != 0) {
          ppsVar89[-2] = local_468 + auVar119._0_8_ + 1;
        }
        if (((auVar128 ^ auVar174) & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          *ppsVar89 = local_468 + (lVar99 - auVar174._8_8_);
        }
        auVar119._0_8_ = auVar119._0_8_ + auVar126._0_8_;
        auVar119._8_8_ = lVar99 + auVar126._8_8_;
        ppsVar89 = ppsVar89 + 4;
        uVar79 = uVar79 - 2;
      } while (uVar79 != 0);
    }
    local_468[uVar97].next = (stbrp_node *)0x0;
    ptr->init_mode = 1;
    ptr->heuristic = 0;
    ptr->free_head = local_468;
    ptr->active_head = ptr->extra;
    ptr->width = uVar60;
    ptr->height = 0x8000 - uVar59;
    ptr->num_nodes = uVar60;
    ptr->align = (int)((uVar60 - 1) + uVar60) / (int)uVar60;
    ptr->extra[0].x = 0;
    ptr->extra[0].y = 0;
    ptr->extra[0].next = ptr->extra + 1;
    ptr->extra[1].x = (stbrp_coord)uVar60;
    ptr->extra[1].y = 0xffff;
    ptr->extra[1].next = (stbrp_node *)0x0;
  }
  local_340 = ptr;
  ImFontAtlasBuildPackCustomRects(atlas,ptr);
  if ((char)local_450 != '\0') {
    uVar97 = 0;
    do {
      lVar99 = uVar97 * 0x110;
      iVar91 = *(int *)((long)pvVar67 + lVar99 + 0xe8);
      if (iVar91 != 0) {
        stbrp_pack_rects(local_340,*(stbrp_rect **)((long)pvVar67 + lVar99 + 200),iVar91);
        lVar81 = (long)*(int *)((long)pvVar67 + lVar99 + 0xe8);
        if (0 < lVar81) {
          lVar99 = *(long *)((long)pvVar67 + lVar99 + 200);
          lVar77 = 0;
          do {
            if (*(int *)(lVar99 + 0xc + lVar77) != 0) {
              iVar91 = (uint)*(ushort *)(lVar99 + 6 + lVar77) +
                       (uint)*(ushort *)(lVar99 + 10 + lVar77);
              if (iVar91 < atlas->TexHeight) {
                iVar91 = atlas->TexHeight;
              }
              atlas->TexHeight = iVar91;
            }
            lVar77 = lVar77 + 0x10;
          } while (lVar81 * 0x10 != lVar77);
        }
      }
      uVar97 = uVar97 + 1;
    } while (uVar97 < (uVar148 & 0xffffffff));
  }
  uVar60 = atlas->TexHeight;
  if ((atlas->Flags & 1) == 0) {
    uVar60 = (int)(uVar60 - 1) >> 1 | uVar60 - 1;
    uVar60 = (int)uVar60 >> 2 | uVar60;
    uVar60 = (int)uVar60 >> 4 | uVar60;
    uVar60 = (int)uVar60 >> 8 | uVar60;
    uVar60 = (int)uVar60 >> 0x10 | uVar60;
  }
  iVar91 = uVar60 + 1;
  atlas->TexHeight = iVar91;
  auVar117._0_4_ = (float)atlas->TexWidth;
  auVar117._4_4_ = (float)iVar91;
  auVar117._8_8_ = 0;
  auVar117 = divps(_DAT_00192a80,auVar117);
  atlas->TexUvScale = auVar117._0_8_;
  puVar66 = (uchar *)ImGui::MemAlloc((long)(iVar91 * atlas->TexWidth));
  atlas->TexPixelsAlpha8 = puVar66;
  memset(puVar66,0,(long)atlas->TexHeight * (long)atlas->TexWidth);
  if ((char)local_450 != '\0') {
    local_388 = atlas->TexPixelsAlpha8;
    lVar81 = (long)iVar78;
    local_298 = pshuflw(ZEXT416(uVar59),ZEXT416(uVar59),0);
    lVar99 = 0;
    auVar119 = _DAT_00192020;
    auVar126 = _DAT_00194380;
    auVar117 = _DAT_00194350;
    do {
      local_338 = lVar99;
      if (*(int *)((long)pvStack_3f0 + lVar99 * 0x110 + 0xe8) != 0) {
        psVar100 = (stbtt_fontinfo *)((long)pvStack_3f0 + lVar99 * 0x110);
        fVar116 = *(float *)&psVar100[1].userdata;
        if (fVar116 <= 0.0) {
          auVar121._4_4_ = auVar119._4_4_;
          auVar121._0_4_ = (uint)fVar116 ^ auVar119._0_4_;
          auVar121._8_4_ = auVar119._8_4_;
          auVar121._12_4_ = auVar119._12_4_;
          uVar59 = (uint)(ushort)(*(ushort *)(psVar100->data + (long)psVar100->head + 0x12) << 8 |
                                 *(ushort *)(psVar100->data + (long)psVar100->head + 0x12) >> 8);
        }
        else {
          puVar66 = psVar100->data;
          lVar99 = (long)psVar100->hhea;
          uVar59 = ((int)(short)((ushort)puVar66[lVar99 + 4] << 8) | (uint)puVar66[lVar99 + 5]) -
                   ((int)(short)((ushort)puVar66[lVar99 + 6] << 8) | (uint)puVar66[lVar99 + 7]);
          auVar121 = ZEXT416((uint)fVar116);
        }
        local_318._4_12_ = auVar121._4_12_;
        local_318._0_4_ = auVar121._0_4_ / (float)(int)uVar59;
        local_300 = (atlas->ConfigData).Data;
        iVar91 = psVar100[1].fontstart;
        if (0 < iVar91) {
          lVar99._0_4_ = psVar100[1].hmtx;
          lVar99._4_4_ = psVar100[1].kern;
          uVar97._0_4_ = psVar100[1].glyf;
          uVar97._4_4_ = psVar100[1].hhea;
          auVar25._8_6_ = 0;
          auVar25._0_8_ = uVar97;
          auVar25[0xe] = (char)((uint)uVar97._4_4_ >> 0x18);
          auVar27._8_4_ = 0;
          auVar27._0_8_ = uVar97;
          auVar27[0xc] = (char)((uint)uVar97._4_4_ >> 0x10);
          auVar27._13_2_ = auVar25._13_2_;
          auVar28._8_4_ = 0;
          auVar28._0_8_ = uVar97;
          auVar28._12_3_ = auVar27._12_3_;
          auVar29._8_2_ = 0;
          auVar29._0_8_ = uVar97;
          auVar29[10] = (char)((uint)uVar97._4_4_ >> 8);
          auVar29._11_4_ = auVar28._11_4_;
          auVar32._8_2_ = 0;
          auVar32._0_8_ = uVar97;
          auVar32._10_5_ = auVar29._10_5_;
          auVar33[8] = (char)uVar97._4_4_;
          auVar33._0_8_ = uVar97;
          auVar33._9_6_ = auVar32._9_6_;
          auVar36._7_8_ = 0;
          auVar36._0_7_ = auVar33._8_7_;
          cVar114 = (char)((uint)(undefined4)uVar97 >> 0x18);
          Var37 = CONCAT81(SUB158(auVar36 << 0x40,7),cVar114);
          auVar43._9_6_ = 0;
          auVar43._0_9_ = Var37;
          cVar112 = (char)((uint)(undefined4)uVar97 >> 0x10);
          auVar34[4] = cVar112;
          auVar34._0_4_ = (undefined4)uVar97;
          auVar34._5_10_ = SUB1510(auVar43 << 0x30,5);
          auVar38._11_4_ = 0;
          auVar38._0_11_ = auVar34._4_11_;
          cVar111 = (char)((uint)(undefined4)uVar97 >> 8);
          auVar39._1_12_ = SUB1512(auVar38 << 0x20,3);
          auVar39[0] = cVar111;
          bVar103 = (byte)(undefined4)uVar97;
          uVar51 = CONCAT11(0,bVar103);
          auVar35._2_13_ = auVar39;
          auVar35._0_2_ = uVar51;
          uVar113 = auVar39._0_2_;
          sVar84 = -auVar34._4_2_;
          sVar115 = (short)Var37;
          sVar52 = -sVar115;
          local_458 = (ulong)uVar113;
          auVar26._10_2_ = 0;
          auVar26._0_10_ = auVar35._0_10_;
          auVar26._12_2_ = sVar115;
          uVar45 = CONCAT42(auVar26._10_4_,auVar34._4_2_);
          auVar40._6_8_ = 0;
          auVar40._0_6_ = uVar45;
          auVar30._4_2_ = uVar113;
          auVar30._0_4_ = auVar35._0_4_;
          auVar30._6_8_ = SUB148(auVar40 << 0x40,6);
          auVar106._0_4_ = (float)uVar51;
          auVar106._4_4_ = (float)auVar30._4_4_;
          auVar106._8_4_ = (float)(int)uVar45;
          auVar106._12_4_ = (float)(auVar26._10_4_ >> 0x10);
          local_268 = divps(_DAT_00192a80,auVar106);
          auVar130[0] = -(bVar103 == 0);
          auVar130[1] = -(bVar103 == 0);
          auVar130[2] = -(bVar103 == 0);
          auVar130[3] = -(bVar103 == 0);
          auVar130[4] = -(cVar111 == '\0');
          auVar130[5] = -(cVar111 == '\0');
          auVar130[6] = -(cVar111 == '\0');
          auVar130[7] = -(cVar111 == '\0');
          auVar130[8] = -(cVar112 == '\0');
          auVar130[9] = -(cVar112 == '\0');
          auVar130[10] = -(cVar112 == '\0');
          auVar130[0xb] = -(cVar112 == '\0');
          auVar130[0xc] = -(cVar114 == '\0');
          auVar130[0xd] = -(cVar114 == '\0');
          auVar130[0xe] = -(cVar114 == '\0');
          auVar130[0xf] = -(cVar114 == '\0');
          Var44 = CONCAT64(CONCAT42(CONCAT22(sVar52,sVar52),sVar84),CONCAT22(sVar84,sVar52));
          auVar41._4_8_ = (long)((unkuint10)Var44 >> 0x10);
          auVar41._2_2_ = 1 - uVar113;
          auVar41._0_2_ = 1 - uVar113;
          auVar118._0_4_ = (float)(int)(short)(1 - uVar51);
          auVar118._4_4_ = (float)(auVar41._0_4_ >> 0x10);
          auVar118._8_4_ = (float)((int)((unkuint10)Var44 >> 0x10) >> 0x10);
          auVar118._12_4_ = (float)(int)sVar52;
          auVar124._0_4_ = (float)local_318._0_4_ * auVar106._0_4_;
          auVar124._4_4_ = (float)local_318._0_4_ * auVar106._4_4_;
          auVar124._8_4_ = (float)local_318._0_4_ * auVar106._8_4_;
          auVar124._12_4_ = (float)local_318._0_4_ * auVar106._12_4_;
          auVar107._0_4_ = auVar106._0_4_ + auVar106._0_4_;
          auVar107._4_4_ = auVar106._4_4_ + auVar106._4_4_;
          auVar107._8_4_ = auVar106._8_4_ + auVar106._8_4_;
          auVar107._12_4_ = auVar106._12_4_ + auVar106._12_4_;
          auVar119 = divps(auVar118,auVar107);
          fVar116 = auVar124._4_4_;
          if (auVar124._0_4_ <= auVar124._4_4_) {
            fVar116 = auVar124._0_4_;
          }
          local_3cc = (0.35 / fVar116) * (0.35 / fVar116);
          local_2b8 = auVar124._4_4_;
          fStack_2b4 = auVar124._4_4_;
          fStack_2b0 = auVar124._4_4_;
          fStack_2ac = auVar124._4_4_;
          uVar59 = (uint)auVar124._4_4_ ^ (uint)DAT_00192020;
          local_328 = (ulong)((undefined4)uVar97 & 0xff);
          local_320 = (ulong)((uint)(undefined4)uVar97 >> 8 & 0xff);
          local_278._4_4_ = local_268._4_4_;
          local_278._0_4_ = local_278._4_4_;
          local_278._8_4_ = local_278._4_4_;
          local_278._12_4_ = local_278._4_4_;
          local_258 = ~auVar130 & auVar119;
          local_288._4_4_ = SUB164(~auVar130 & auVar119,4);
          local_288._0_4_ = local_288._4_4_;
          local_288._8_4_ = local_288._4_4_;
          local_288._12_4_ = local_288._4_4_;
          local_3d8 = (ulong)(auVar35._0_4_ & 0xff);
          local_2a8 = auVar124;
          local_248._4_4_ = uVar59;
          local_248._0_4_ = auVar124._0_4_;
          fStack_240 = auVar124._0_4_;
          fStack_23c = (float)uVar59;
          lVar77 = 0;
          local_3b8 = psVar100;
          local_2d0 = lVar99;
          auVar119 = _DAT_00192020;
          do {
            if (*(int *)(lVar99 + 0xc + lVar77 * 0x10) != 0) {
              lVar99 = lVar77 * 0x10 + lVar99;
              local_2c8 = (short *)(lVar77 * 0x1c + *(long *)&psVar100[1].loca);
              info = (stbtt_fontinfo *)psVar100->data;
              local_370 = lVar77;
              iVar61 = stbtt_FindGlyphIndex(info,psVar100->index_map);
              uVar148 = *(undefined8 *)(lVar99 + 4);
              *(ulong *)(lVar99 + 4) =
                   CONCAT44(CONCAT22((short)((ulong)uVar148 >> 0x30) + local_298._6_2_,
                                     (short)((ulong)uVar148 >> 0x20) + local_298._4_2_),
                            CONCAT22((short)((ulong)uVar148 >> 0x10) - local_298._2_2_,
                                     (short)uVar148 - local_298._0_2_));
              uVar51 = *(ushort *)((long)&info->glyf + (long)psVar100->hhea + 2);
              uVar51 = uVar51 << 8 | uVar51 >> 8;
              iVar91 = psVar100->hmtx;
              pbVar90 = (byte *)((long)info + (ulong)uVar51 * 4 + (long)iVar91 + -4);
              pbVar101 = (byte *)((long)info + (ulong)uVar51 * 4 + (long)iVar91 + -3);
              if (iVar61 < (int)(uint)uVar51) {
                pbVar90 = (byte *)((long)&info->userdata + (long)(iVar61 * 4) + (long)iVar91);
                pbVar101 = (byte *)((long)&info->userdata + (long)(iVar61 * 4) + 1 + (long)iVar91);
              }
              local_358 = (uint)*pbVar101;
              local_354 = (uint)*pbVar90;
              auVar117 = local_298;
              stbtt_GetGlyphBitmapBoxSubpixel
                        (psVar100,iVar61,(float)local_2a8._0_4_,local_2b8,local_298._0_4_,
                         auVar124._0_4_,&local_348,&local_34c,&local_2bc,&local_2c0);
              fVar116 = auVar117._0_4_;
              uVar51 = *(ushort *)(lVar99 + 8);
              uVar113 = *(ushort *)(lVar99 + 10);
              local_420 = (ulong)*(ushort *)(lVar99 + 4);
              local_3e0 = (ulong)*(ushort *)(lVar99 + 6);
              local_368 = lVar99;
              uVar59 = stbtt_GetGlyphShape(psVar100,iVar61,(stbtt_vertex **)&local_418);
              sVar53 = ((int)local_420 - (int)local_3d8) + 1;
              stbtt_GetGlyphBitmapBoxSubpixel
                        (local_3b8,iVar61,(float)local_2a8._0_4_,local_2b8,fVar116,auVar124._0_4_,
                         (int *)&local_478,&local_344,(int *)0x0,(int *)0x0);
              sVar58 = local_478;
              local_474 = sVar53;
              if (sVar53 != 0) {
                iVar91 = ((int)local_3e0 - (int)local_458) + 1;
                if ((iVar91 != 0) && (0 < (int)uVar59)) {
                  local_2e0 = local_388 + (ulong)uVar113 * lVar81 + (ulong)uVar51;
                  local_420 = (ulong)(uint)((int)local_420 - (int)local_3d8);
                  local_3e0 = (ulong)(uint)((int)local_3e0 - (int)local_458);
                  lVar99 = CONCAT44(local_418._4_4_,(stbtt_uint32)local_418);
                  local_410 = local_344;
                  lVar77 = 0;
                  uVar60 = 0;
                  do {
                    uVar60 = uVar60 + (*(char *)(lVar99 + 0xc + lVar77) == '\x01');
                    lVar77 = lVar77 + 0xe;
                  } while ((ulong)uVar59 * 0xe != lVar77);
                  if ((uVar60 != 0) &&
                     (local_428 = ImGui::MemAlloc((ulong)uVar60 * 4), local_428 != (void *)0x0)) {
                    uVar98 = 1;
                    bVar102 = false;
                    iVar62 = 0;
                    auVar126._8_8_ = 0;
                    auVar126._0_8_ = local_448._8_8_;
                    local_448 = auVar126 << 0x40;
                    iVar61 = 0;
                    do {
                      if (bVar102) {
                        pvVar67 = ImGui::MemAlloc((long)iVar61 << 3);
                        local_448._0_8_ = pvVar67;
                        if (pvVar67 == (void *)0x0) {
                          ImGui::MemFree((void *)0x0);
                          ImGui::MemFree(local_428);
                          goto LAB_00139e7b;
                        }
                      }
                      local_238[0].data = (uchar *)((ulong)local_238[0].data & 0xffffffff00000000);
                      fVar116 = 0.0;
                      fVar104 = 0.0;
                      uVar96 = 0xffffffff;
                      lVar77 = 0;
                      do {
                        iVar61 = (int)local_238[0].data;
                        switch(*(undefined1 *)(lVar99 + 0xc + lVar77)) {
                        case 1:
                          if (-1 < (int)uVar96) {
                            *(int *)((long)local_428 + (ulong)uVar96 * 4) =
                                 (int)local_238[0].data - iVar62;
                          }
                          uVar96 = uVar96 + 1;
                          auVar117 = pshuflw(ZEXT416(*(uint *)(lVar99 + lVar77)),
                                             ZEXT416(*(uint *)(lVar99 + lVar77)),0x60);
                          fVar116 = (float)(auVar117._0_4_ >> 0x10);
                          fVar104 = (float)(auVar117._4_4_ >> 0x10);
                          local_238[0].data =
                               (uchar *)CONCAT44(local_238[0].data._4_4_,(int)local_238[0].data + 1)
                          ;
                          iVar62 = iVar61;
                          if ((stbtt__point *)local_448._0_8_ != (stbtt__point *)0x0) {
                            ((stbtt__point *)(local_448._0_8_ + (long)iVar61 * 8))->x = fVar116;
                            ((stbtt__point *)(local_448._0_8_ + (long)iVar61 * 8))->y = fVar104;
                          }
                          break;
                        case 2:
                          lVar68 = (long)(int)local_238[0].data;
                          auVar117 = pshuflw(ZEXT416(*(uint *)(lVar99 + lVar77)),
                                             ZEXT416(*(uint *)(lVar99 + lVar77)),0x60);
                          fVar116 = (float)(auVar117._0_4_ >> 0x10);
                          fVar104 = (float)(auVar117._4_4_ >> 0x10);
                          local_238[0].data =
                               (uchar *)CONCAT44(local_238[0].data._4_4_,(int)local_238[0].data + 1)
                          ;
                          if ((stbtt__point *)local_448._0_8_ != (stbtt__point *)0x0) {
                            ((stbtt__point *)(local_448._0_8_ + lVar68 * 8))->x = fVar116;
                            ((stbtt__point *)(local_448._0_8_ + lVar68 * 8))->y = fVar104;
                          }
                          break;
                        case 3:
                          fVar133 = (float)(int)*(short *)(lVar99 + 6 + lVar77);
                          auVar124 = ZEXT416((uint)fVar133);
                          stbtt__tesselate_curve
                                    ((stbtt__point *)local_448._0_8_,(int *)local_238,fVar116,
                                     fVar104,(float)(int)*(short *)(lVar99 + 4 + lVar77),fVar133,
                                     (float)(int)*(short *)(lVar99 + lVar77),
                                     (float)(int)*(short *)(lVar99 + 2 + lVar77),local_3cc,0);
                          goto LAB_00139243;
                        case 4:
                          fVar133 = (float)(int)*(short *)(lVar99 + 6 + lVar77);
                          auVar124 = ZEXT416((uint)fVar133);
                          stbtt__tesselate_cubic
                                    ((stbtt__point *)local_448._0_8_,(int *)local_238,fVar116,
                                     fVar104,(float)(int)*(short *)(lVar99 + 4 + lVar77),fVar133,
                                     (float)(int)*(short *)(lVar99 + 8 + lVar77),
                                     (float)(int)*(short *)(lVar99 + 10 + lVar77),
                                     (float)(int)*(short *)(lVar99 + lVar77),
                                     (float)(int)*(short *)(lVar99 + 2 + lVar77),local_3cc,0);
LAB_00139243:
                          auVar117 = pshuflw(ZEXT416(*(uint *)(lVar99 + lVar77)),
                                             ZEXT416(*(uint *)(lVar99 + lVar77)),0x60);
                          fVar116 = (float)(auVar117._0_4_ >> 0x10);
                          fVar104 = (float)(auVar117._4_4_ >> 0x10);
                        }
                        lVar77 = lVar77 + 0xe;
                      } while ((ulong)uVar59 * 0xe != lVar77);
                      *(int *)((long)local_428 + (long)(int)uVar96 * 4) =
                           (int)local_238[0].data - iVar62;
                      bVar102 = true;
                      uVar96 = uVar98 & 1;
                      uVar98 = 0;
                      iVar61 = (int)local_238[0].data;
                    } while (uVar96 != 0);
                    pvVar67 = (void *)local_448._0_8_;
                    if ((void *)local_448._0_8_ != (void *)0x0) {
                      uVar97 = 0;
                      lVar99 = 0;
                      do {
                        lVar99 = (long)(int)lVar99 + (long)*(int *)((long)local_428 + uVar97 * 4);
                        uVar97 = uVar97 + 1;
                      } while (uVar60 != uVar97);
                      local_460 = (stbtt__edge *)ImGui::MemAlloc(lVar99 * 0x14 + 0x14);
                      if (local_460 != (stbtt__edge *)0x0) {
                        uVar97 = 0;
                        uVar59 = 0;
                        iVar61 = 0;
                        do {
                          iVar62 = *(int *)((long)local_428 + uVar97 * 4);
                          if (0 < iVar62) {
                            lVar99 = local_448._0_8_ + (long)iVar61 * 8;
                            uVar76 = (ulong)(iVar62 - 1);
                            uVar79 = 0;
                            iVar136 = iVar62;
                            do {
                              iVar94 = (int)uVar76;
                              fVar116 = *(float *)(lVar99 + 4 + (long)iVar94 * 8);
                              fVar104 = *(float *)((long)pvVar67 + uVar79 * 8 + (long)iVar61 * 8 + 4
                                                  );
                              if ((fVar116 != fVar104) || (NAN(fVar116) || NAN(fVar104))) {
                                iVar95 = (int)uVar79;
                                iVar136 = iVar94;
                                if (fVar116 <= fVar104) {
                                  iVar136 = iVar95;
                                  iVar95 = iVar94;
                                }
                                local_460[(int)uVar59].invert = (uint)(fVar104 < fVar116);
                                uVar148 = *(undefined8 *)(lVar99 + (long)iVar136 * 8);
                                uVar171 = *(undefined8 *)(lVar99 + (long)iVar95 * 8);
                                psVar86 = local_460 + (int)uVar59;
                                psVar86->x0 = (float)uVar148 * (float)local_248._0_4_ + 0.0;
                                psVar86->y0 = (float)((ulong)uVar148 >> 0x20) *
                                              (float)local_248._4_4_ + 0.0;
                                psVar86->x1 = (float)uVar171 * fStack_240 + 0.0;
                                psVar86->y1 = (float)((ulong)uVar171 >> 0x20) * fStack_23c + 0.0;
                                uVar59 = uVar59 + 1;
                                iVar136 = *(int *)((long)local_428 + uVar97 * 4);
                              }
                              uVar76 = uVar79 & 0xffffffff;
                              uVar79 = uVar79 + 1;
                            } while ((long)uVar79 < (long)iVar136);
                          }
                          iVar61 = iVar61 + iVar62;
                          uVar97 = uVar97 + 1;
                        } while (uVar97 != uVar60);
                        stbtt__sort_edges_quicksort(local_460,uVar59);
                        if (1 < (int)uVar59) {
                          uVar97 = 1;
                          lVar99 = 2;
                          psVar86 = local_460;
                          do {
                            uVar4 = local_460[uVar97].x0;
                            uVar5 = local_460[uVar97].y0;
                            iVar61 = local_460[uVar97].invert;
                            local_238[0].cursor = iVar61;
                            local_238[0].data = *(uchar **)&local_460[uVar97].x1;
                            lVar77 = lVar99;
                            psVar93 = psVar86;
                            do {
                              if (psVar93->y0 <= (float)uVar5) {
                                uVar60 = (int)lVar77 - 1;
                                goto LAB_00139491;
                              }
                              psVar93[1].invert = psVar93->invert;
                              fVar116 = psVar93->y0;
                              fVar104 = psVar93->x1;
                              fVar133 = psVar93->y1;
                              psVar93[1].x0 = psVar93->x0;
                              psVar93[1].y0 = fVar116;
                              psVar93[1].x1 = fVar104;
                              psVar93[1].y1 = fVar133;
                              lVar77 = lVar77 + -1;
                              psVar93 = psVar93 + -1;
                            } while (1 < lVar77);
                            uVar60 = 0;
LAB_00139491:
                            if (uVar97 != uVar60) {
                              local_460[(int)uVar60].x0 = (float)uVar4;
                              local_460[(int)uVar60].y0 = (float)uVar5;
                              *(uchar **)&local_460[(int)uVar60].x1 = local_238[0].data;
                              local_460[(int)uVar60].invert = iVar61;
                            }
                            uVar97 = uVar97 + 1;
                            lVar99 = lVar99 + 1;
                            psVar86 = psVar86 + 1;
                          } while (uVar97 != uVar59);
                        }
                        local_470 = (undefined1  [8])0x0;
                        scanline = local_238;
                        if (0x3f < (int)(uint)local_420) {
                          scanline = (stbtt__buf *)ImGui::MemAlloc((ulong)local_474 * 8 + 4);
                        }
                        local_460[(int)uVar59].y0 = (float)(iVar91 + local_410) + 1.0;
                        if ((uint)local_3e0 < 0x7fffffff) {
                          local_350 = (float)(int)sVar58;
                          local_2f8 = (long)(int)local_474;
                          local_360 = (float *)((long)&scanline->data + local_2f8 * 4);
                          local_330 = local_360 + 1;
                          local_2e8 = local_2f8 * 4;
                          local_40c = (float)(int)local_474;
                          local_2f0 = (long)(int)(uint)local_420 * 4 + 8;
                          local_378 = 0;
                          auVar70 = (undefined1  [8])0x0;
                          local_2d8 = 0;
                          local_380 = (undefined8 *)0x0;
                          local_3d0 = 0;
                          local_3b0 = (stbtt__active_edge *)0x0;
                          psVar86 = local_460;
                          do {
                            fVar116 = (float)local_410;
                            fVar104 = fVar116 + 1.0;
                            memset(scanline,0,local_2e8);
                            memset(local_360,0,local_2f0);
                            if (auVar70 != (undefined1  [8])0x0) {
                              psVar69 = (stbtt__active_edge *)local_470;
                              do {
                                if (((stbtt__active_edge *)auVar70)->ey <= fVar116) {
                                  psVar69->next = ((stbtt__active_edge *)auVar70)->next;
                                  ((stbtt__active_edge *)auVar70)->direction = 0.0;
                                  ((stbtt__active_edge *)auVar70)->next = local_3b0;
                                  local_3b0 = (stbtt__active_edge *)auVar70;
                                  auVar70 = (undefined1  [8])psVar69;
                                }
                                ppsVar50 = &((stbtt__active_edge *)auVar70)->next;
                                psVar69 = (stbtt__active_edge *)auVar70;
                                auVar70 = (undefined1  [8])*ppsVar50;
                              } while (*ppsVar50 != (stbtt__active_edge *)0x0);
                            }
                            fVar133 = psVar86->y0;
                            iVar91 = local_3d0;
                            psVar69 = local_3b0;
                            puVar80 = local_380;
                            while (fVar133 <= fVar104) {
                              fVar134 = psVar86->y1;
                              if ((fVar133 != fVar134) ||
                                 (psVar73 = psVar69, NAN(fVar133) || NAN(fVar134))) {
                                puVar72 = puVar80;
                                if (psVar69 == (stbtt__active_edge *)0x0) {
                                  if (iVar91 == 0) {
                                    puVar72 = (undefined8 *)ImGui::MemAlloc(0x6408);
                                    if (puVar72 == (undefined8 *)0x0) {
                                      psVar73 = (stbtt__active_edge *)0x0;
                                      iVar91 = 0;
                                      goto LAB_00139de7;
                                    }
                                    *puVar72 = puVar80;
                                    fVar133 = psVar86->y0;
                                    fVar134 = psVar86->y1;
                                    iVar91 = 799;
                                  }
                                  else {
                                    iVar91 = iVar91 + -1;
                                  }
                                  psVar69 = (stbtt__active_edge *)(puVar72 + (long)iVar91 * 4 + 1);
                                  psVar73 = (stbtt__active_edge *)0x0;
                                }
                                else {
                                  psVar73 = psVar69->next;
                                }
                                fVar135 = psVar86->x0;
                                fVar137 = (psVar86->x1 - fVar135) / (fVar134 - fVar133);
                                psVar69->fdx = fVar137;
                                psVar69->fdy = (float)(-(uint)(fVar137 != 0.0) &
                                                      (uint)(1.0 / fVar137));
                                psVar69->fx = ((fVar116 - fVar133) * fVar137 + fVar135) - local_350;
                                psVar69->direction =
                                     *(float *)(&DAT_0019440c + (ulong)(psVar86->invert == 0) * 4);
                                psVar69->sy = fVar133;
                                psVar69->ey = fVar134;
                                psVar69->next = (stbtt__active_edge *)0x0;
                                psVar69->next = (stbtt__active_edge *)local_470;
                                local_470 = (undefined1  [8])psVar69;
                                puVar80 = puVar72;
                              }
LAB_00139de7:
                              psVar93 = psVar86 + 1;
                              psVar86 = psVar86 + 1;
                              psVar69 = psVar73;
                              fVar133 = psVar93->y0;
                            }
                            local_3b0 = psVar69;
                            local_3d0 = iVar91;
                            local_380 = puVar80;
                            puVar80 = local_380;
                            auVar70 = local_470;
                            iVar91 = local_410;
                            uVar97 = local_2d8;
                            for (psVar69 = (stbtt__active_edge *)local_470; local_470 = auVar70,
                                local_380 = puVar80, psVar69 != (stbtt__active_edge *)0x0;
                                psVar69 = psVar69->next) {
                              fVar133 = psVar69->fx;
                              fVar134 = psVar69->fdx;
                              local_410 = iVar91;
                              local_2d8 = uVar97;
                              if ((fVar134 != 0.0) || (NAN(fVar134))) {
                                fVar141 = fVar134 + fVar133;
                                fVar135 = psVar69->sy;
                                fVar137 = (float)(~-(uint)(fVar116 < fVar135) & (uint)fVar133 |
                                                 (uint)((fVar135 - fVar116) * fVar134 + fVar133) &
                                                 -(uint)(fVar116 < fVar135));
                                if (0.0 <= fVar137) {
                                  fVar142 = psVar69->ey;
                                  fVar144 = (float)(-(uint)(fVar142 < fVar104) &
                                                    (uint)((fVar142 - fVar116) * fVar134 + fVar133)
                                                   | ~-(uint)(fVar142 < fVar104) & (uint)fVar141);
                                  if (((0.0 <= fVar144) && (fVar137 < local_40c)) &&
                                     (fVar144 < local_40c)) {
                                    if (fVar135 <= fVar116) {
                                      fVar135 = fVar116;
                                    }
                                    iVar91 = (int)fVar137;
                                    if (fVar104 <= fVar142) {
                                      fVar142 = fVar104;
                                    }
                                    iVar61 = (int)fVar144;
                                    if (iVar91 == iVar61) {
                                      lVar99 = (long)iVar91;
                                      *(float *)((long)&scanline->data + lVar99 * 4) =
                                           (((fVar144 - (float)iVar91) + (fVar137 - (float)iVar91))
                                            * -0.5 + 1.0) * psVar69->direction * (fVar142 - fVar135)
                                           + *(float *)((long)&scanline->data + lVar99 * 4);
                                      fVar133 = (fVar142 - fVar135) * psVar69->direction;
                                    }
                                    else {
                                      fVar134 = psVar69->fdy;
                                      iVar62 = iVar91;
                                      fVar145 = fVar137;
                                      if (fVar144 < fVar137) {
                                        fVar154 = fVar116 - fVar135;
                                        fVar135 = (fVar116 - fVar142) + fVar104;
                                        fVar134 = -fVar134;
                                        iVar62 = iVar61;
                                        iVar61 = iVar91;
                                        fVar133 = fVar141;
                                        fVar145 = fVar144;
                                        fVar144 = fVar137;
                                        fVar142 = fVar154 + fVar104;
                                      }
                                      iVar91 = iVar62 + 1;
                                      fVar141 = ((float)iVar91 - fVar133) * fVar134 + fVar116;
                                      fVar133 = psVar69->direction;
                                      fVar137 = (fVar141 - fVar135) * fVar133;
                                      lVar99 = (long)iVar62;
                                      *(float *)((long)&scanline->data + lVar99 * 4) =
                                           (((fVar145 - (float)iVar62) + 1.0) * -0.5 + 1.0) *
                                           fVar137 + *(float *)((long)&scanline->data + lVar99 * 4);
                                      if (iVar61 - iVar91 != 0 && iVar91 <= iVar61) {
                                        do {
                                          *(float *)((long)&scanline->data + lVar99 * 4 + 4) =
                                               fVar134 * fVar133 * 0.5 + fVar137 +
                                               *(float *)((long)&scanline->data + lVar99 * 4 + 4);
                                          fVar137 = fVar137 + fVar134 * fVar133;
                                          lVar99 = lVar99 + 1;
                                        } while (iVar61 + -1 != (int)lVar99);
                                      }
                                      lVar99 = (long)iVar61;
                                      *(float *)((long)&scanline->data + lVar99 * 4) =
                                           (fVar142 - (fVar134 * (float)(iVar61 - iVar91) + fVar141)
                                           ) * (((fVar144 - (float)iVar61) + 0.0) * -0.5 + 1.0) *
                                               fVar133 + fVar137 +
                                           *(float *)((long)&scanline->data + lVar99 * 4);
                                      fVar133 = (fVar142 - fVar135) * fVar133;
                                    }
                                    local_330[lVar99] = fVar133 + local_330[lVar99];
                                    goto LAB_00139bfc;
                                  }
                                }
                                if ((uint)local_420 < 0x7fffffff) {
                                  local_398 = (ulong)(uint)fVar133;
                                  uStack_390 = 0;
                                  uStack_38c = 0;
                                  local_450._4_4_ = (undefined4)((ulong)local_450 >> 0x20);
                                  local_450 = CONCAT44(local_450._4_4_,fVar134);
                                  local_438 = ZEXT416((uint)fVar141);
                                  sVar58 = 0;
                                  do {
                                    fVar137 = (float)(int)sVar58;
                                    sVar53 = sVar58 + 1;
                                    fVar141 = (float)(int)sVar53;
                                    fVar135 = (fVar137 - fVar133) / fVar134 + fVar116;
                                    fVar134 = (fVar141 - fVar133) / fVar134 + fVar116;
                                    fVar142 = local_438._0_4_;
                                    if ((fVar137 <= fVar133) || (fVar142 <= fVar141)) {
                                      if ((fVar137 <= fVar142) || (fVar133 <= fVar141)) {
                                        fVar144 = fVar116;
                                        if (((fVar137 <= fVar133) || (fVar142 <= fVar137)) &&
                                           ((fVar137 <= fVar142 || (fVar133 <= fVar137)))) {
                                          fVar135 = fVar116;
                                          if (((fVar133 < fVar141) && (fVar141 < fVar142)) ||
                                             ((fVar137 = fVar133, fVar142 < fVar141 &&
                                              (fVar141 < fVar133)))) goto LAB_001398f3;
                                          goto LAB_001399a1;
                                        }
                                      }
                                      else {
                                        stbtt__handle_clipped_edge
                                                  ((float *)scanline,sVar58,psVar69,fVar133,fVar116,
                                                   fVar141,fVar134);
                                        fVar133 = fVar141;
                                        fVar144 = fVar134;
                                      }
                                      stbtt__handle_clipped_edge
                                                ((float *)scanline,sVar58,psVar69,fVar133,fVar144,
                                                 fVar137,fVar135);
                                    }
                                    else {
                                      stbtt__handle_clipped_edge
                                                ((float *)scanline,sVar58,psVar69,fVar133,fVar116,
                                                 fVar137,fVar135);
                                      fVar133 = fVar137;
LAB_001398f3:
                                      stbtt__handle_clipped_edge
                                                ((float *)scanline,sVar58,psVar69,fVar133,fVar135,
                                                 fVar141,fVar134);
                                      fVar137 = fVar141;
                                      fVar135 = fVar134;
                                    }
LAB_001399a1:
                                    stbtt__handle_clipped_edge
                                              ((float *)scanline,sVar58,psVar69,fVar137,fVar135,
                                               local_438._0_4_,fVar104);
                                    fVar133 = (float)local_398;
                                    fVar134 = (float)local_450;
                                    sVar58 = sVar53;
                                  } while (local_474 != sVar53);
                                }
                              }
                              else if (fVar133 < local_40c) {
                                if (0.0 <= fVar133) {
                                  local_398 = (ulong)(uint)fVar133;
                                  uStack_390 = 0;
                                  uStack_38c = 0;
                                  stbtt__handle_clipped_edge
                                            ((float *)scanline,(int)fVar133,psVar69,fVar133,fVar116,
                                             fVar133,fVar104);
                                  iVar91 = (int)fVar133 + 1;
                                  fVar133 = (float)local_398;
                                }
                                else {
                                  iVar91 = 0;
                                }
                                stbtt__handle_clipped_edge
                                          (local_360,iVar91,psVar69,fVar133,fVar116,fVar133,fVar104)
                                ;
                              }
LAB_00139bfc:
                              puVar80 = local_380;
                              auVar70 = local_470;
                              iVar91 = local_410;
                              uVar97 = local_2d8;
                            }
                            uVar59 = (uint)DAT_00192ab0;
                            auVar124._0_12_ = ZEXT812(0x437f0000);
                            auVar124._12_4_ = 0.0;
                            psVar69 = (stbtt__active_edge *)auVar70;
                            if ((uint)local_420 < 0x7fffffff) {
                              fVar116 = 0.0;
                              psVar71 = scanline;
                              uVar79 = local_378;
                              lVar99 = local_2f8;
                              do {
                                fVar116 = fVar116 + *(float *)((long)&psVar71->data + local_2f8 * 4)
                                ;
                                iVar61 = (int)((float)((uint)(*(float *)&psVar71->data + fVar116) &
                                                      uVar59) * 255.0 + 0.5);
                                uVar83 = (uchar)iVar61;
                                if (0xfe < iVar61) {
                                  uVar83 = 0xff;
                                }
                                local_2e0[(int)uVar79] = uVar83;
                                uVar79 = (ulong)((int)uVar79 + 1);
                                psVar71 = (stbtt__buf *)((long)&psVar71->data + 4);
                                lVar99 = lVar99 + -1;
                              } while (lVar99 != 0);
                            }
                            for (; psVar69 != (stbtt__active_edge *)0x0; psVar69 = psVar69->next) {
                              psVar69->fx = psVar69->fdx + psVar69->fx;
                            }
                            local_410 = iVar91 + 1;
                            local_2d8 = (ulong)((int)uVar97 + 1);
                            local_378 = (ulong)(uint)((int)local_378 + iVar78);
                          } while ((int)uVar97 != (uint)local_3e0);
                          while (local_2d8 = uVar97, local_410 = iVar91,
                                puVar80 != (undefined8 *)0x0) {
                            puVar72 = (undefined8 *)*puVar80;
                            ImGui::MemFree(puVar80);
                            puVar80 = puVar72;
                            iVar91 = local_410;
                            uVar97 = local_2d8;
                          }
                        }
                        pvVar67 = (void *)local_448._0_8_;
                        if (scanline != local_238) {
                          ImGui::MemFree(scanline);
                        }
                        ImGui::MemFree(local_460);
                      }
                      ImGui::MemFree(local_428);
                      ImGui::MemFree(pvVar67);
                    }
                  }
                }
              }
LAB_00139e7b:
              ImGui::MemFree((void *)CONCAT44(local_418._4_4_,(stbtt_uint32)local_418));
              uVar97 = (ulong)*(ushort *)(local_368 + 8);
              uVar51 = *(ushort *)(local_368 + 10);
              uVar59 = (uint)*(ushort *)(local_368 + 4);
              uVar113 = *(ushort *)(local_368 + 6);
              auVar126 = _DAT_00194380;
              auVar117 = _DAT_00194350;
              if (1 < (byte)local_328) {
                local_238[0].data = (uchar *)0x0;
                uVar60 = 0;
                if (uVar113 == 0) {
                  uVar113 = 0;
                }
                else {
                  uVar59 = (uint)*(ushort *)(local_368 + 4);
                  puVar66 = local_388 +
                            (long)(int)((uint)uVar51 * iVar78) + (ulong)*(ushort *)(local_368 + 8);
                  iVar91 = uVar59 - (int)local_3d8;
                  uVar98 = iVar91 + 1;
                  uVar97 = (ulong)uVar98;
                  do {
                    uVar79 = local_328;
                    memset(local_238,0,local_328);
                    auVar126 = _DAT_00194380;
                    auVar117 = _DAT_00194350;
                    uVar96 = uVar98;
                    switch((int)uVar79) {
                    case 2:
                      if (iVar91 < 0) {
LAB_0013a109:
                        uVar79 = 0;
                        uVar96 = 0;
                      }
                      else {
                        uVar76 = 0;
                        uVar79 = 0;
                        do {
                          bVar103 = puVar66[uVar76];
                          bVar6 = *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar76 & 7));
                          *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar76 + 2 & 7)) =
                               bVar103;
                          uVar74 = (int)uVar79 + ((uint)bVar103 - (uint)bVar6);
                          uVar79 = (ulong)uVar74;
                          puVar66[uVar76] = (uchar)(uVar74 >> 1);
                          uVar76 = uVar76 + 1;
                        } while (uVar97 != uVar76);
                      }
                      break;
                    case 3:
                      if (iVar91 < 0) goto LAB_0013a109;
                      uVar76 = 0;
                      uVar79 = 0;
                      do {
                        bVar103 = puVar66[uVar76];
                        bVar6 = *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar76 & 7));
                        *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar76 + 3 & 7)) =
                             bVar103;
                        uVar79 = (ulong)((int)uVar79 + ((uint)bVar103 - (uint)bVar6));
                        puVar66[uVar76] = (uchar)(uVar79 / 3);
                        uVar76 = uVar76 + 1;
                      } while (uVar97 != uVar76);
                      break;
                    case 4:
                      if (iVar91 < 0) goto LAB_0013a109;
                      uVar76 = 0;
                      uVar79 = 0;
                      do {
                        bVar103 = puVar66[uVar76];
                        uVar87 = (ulong)((uint)uVar76 & 7);
                        bVar6 = *(byte *)((long)&local_238[0].data + uVar87);
                        *(byte *)((long)&local_238[0].data + (uVar87 ^ 4)) = bVar103;
                        uVar74 = (int)uVar79 + ((uint)bVar103 - (uint)bVar6);
                        uVar79 = (ulong)uVar74;
                        puVar66[uVar76] = (uchar)(uVar74 >> 2);
                        uVar76 = uVar76 + 1;
                      } while (uVar97 != uVar76);
                      break;
                    case 5:
                      if (iVar91 < 0) goto LAB_0013a109;
                      uVar76 = 0;
                      uVar79 = 0;
                      do {
                        bVar103 = puVar66[uVar76];
                        bVar6 = *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar76 & 7));
                        *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar76 + 5 & 7)) =
                             bVar103;
                        uVar79 = (ulong)((int)uVar79 + ((uint)bVar103 - (uint)bVar6));
                        puVar66[uVar76] = (uchar)(uVar79 / 5);
                        uVar76 = uVar76 + 1;
                      } while (uVar97 != uVar76);
                      break;
                    default:
                      if (iVar91 < 0) {
                        uVar79 = 0;
                        uVar96 = 0;
                      }
                      else {
                        uVar76 = 0;
                        uVar79 = 0;
                        do {
                          bVar103 = puVar66[uVar76];
                          bVar6 = *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar76 & 7));
                          *(byte *)((long)&local_238[0].data +
                                   (ulong)((int)local_3d8 + (uint)uVar76 & 7)) = bVar103;
                          uVar79 = (ulong)((int)uVar79 + ((uint)bVar103 - (uint)bVar6));
                          puVar66[uVar76] = (uchar)(uVar79 / (local_3d8 & 0xffffffff));
                          uVar76 = uVar76 + 1;
                        } while (uVar97 != uVar76);
                      }
                    }
                    if ((int)uVar96 < (int)uVar59) {
                      uVar76 = (ulong)uVar96;
                      do {
                        uVar79 = (ulong)((int)uVar79 -
                                        (uint)*(byte *)((long)&local_238[0].data +
                                                       (ulong)((uint)uVar76 & 7)));
                        puVar66[uVar76] = (uchar)(uVar79 / (local_3d8 & 0xffffffff));
                        uVar76 = uVar76 + 1;
                      } while ((int)uVar76 < (int)uVar59);
                    }
                    puVar66 = puVar66 + lVar81;
                    uVar60 = uVar60 + 1;
                  } while (uVar60 != uVar113);
                  uVar97 = (ulong)*(ushort *)(local_368 + 8);
                  uVar51 = *(ushort *)(local_368 + 10);
                  uVar59 = (uint)*(ushort *)(local_368 + 4);
                  uVar113 = *(ushort *)(local_368 + 6);
                }
              }
              sVar84 = (short)uVar97;
              if (1 < (byte)local_320) {
                local_238[0].data = (uchar *)0x0;
                uVar60 = 0;
                if ((short)uVar59 == 0) {
                  uVar59 = 0;
                }
                else {
                  pbVar101 = local_388 + (long)(int)((uint)uVar51 * iVar78) + uVar97;
                  iVar91 = (uint)uVar113 - (int)(float)local_458;
                  uVar98 = iVar91 + 1;
                  uVar97 = (ulong)uVar98;
                  do {
                    uVar79 = local_320;
                    memset(local_238,0,local_320);
                    auVar126 = _DAT_00194380;
                    auVar117 = _DAT_00194350;
                    uVar96 = uVar98;
                    switch((int)uVar79) {
                    case 2:
                      if (iVar91 < 0) {
LAB_0013a4b6:
                        uVar79 = 0;
                        uVar96 = 0;
                      }
                      else {
                        uVar76 = 0;
                        uVar79 = 0;
                        pbVar90 = pbVar101;
                        do {
                          bVar103 = *pbVar90;
                          bVar6 = *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar76 & 7));
                          *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar76 + 2 & 7)) =
                               bVar103;
                          uVar74 = (int)uVar79 + ((uint)bVar103 - (uint)bVar6);
                          uVar79 = (ulong)uVar74;
                          *pbVar90 = (byte)(uVar74 >> 1);
                          uVar76 = uVar76 + 1;
                          pbVar90 = pbVar90 + lVar81;
                        } while (uVar97 != uVar76);
                      }
                      break;
                    case 3:
                      if (iVar91 < 0) goto LAB_0013a4b6;
                      uVar76 = 0;
                      uVar79 = 0;
                      pbVar90 = pbVar101;
                      do {
                        bVar103 = *pbVar90;
                        bVar6 = *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar76 & 7));
                        *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar76 + 3 & 7)) =
                             bVar103;
                        uVar79 = (ulong)((int)uVar79 + ((uint)bVar103 - (uint)bVar6));
                        *pbVar90 = (byte)(uVar79 / 3);
                        uVar76 = uVar76 + 1;
                        pbVar90 = pbVar90 + lVar81;
                      } while (uVar97 != uVar76);
                      break;
                    case 4:
                      if (iVar91 < 0) goto LAB_0013a4b6;
                      uVar76 = 0;
                      uVar79 = 0;
                      pbVar90 = pbVar101;
                      do {
                        bVar103 = *pbVar90;
                        uVar87 = (ulong)((uint)uVar76 & 7);
                        bVar6 = *(byte *)((long)&local_238[0].data + uVar87);
                        *(byte *)((long)&local_238[0].data + (uVar87 ^ 4)) = bVar103;
                        uVar74 = (int)uVar79 + ((uint)bVar103 - (uint)bVar6);
                        uVar79 = (ulong)uVar74;
                        *pbVar90 = (byte)(uVar74 >> 2);
                        uVar76 = uVar76 + 1;
                        pbVar90 = pbVar90 + lVar81;
                      } while (uVar97 != uVar76);
                      break;
                    case 5:
                      if (iVar91 < 0) goto LAB_0013a4b6;
                      uVar76 = 0;
                      uVar79 = 0;
                      pbVar90 = pbVar101;
                      do {
                        bVar103 = *pbVar90;
                        bVar6 = *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar76 & 7));
                        *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar76 + 5 & 7)) =
                             bVar103;
                        uVar79 = (ulong)((int)uVar79 + ((uint)bVar103 - (uint)bVar6));
                        *pbVar90 = (byte)(uVar79 / 5);
                        uVar76 = uVar76 + 1;
                        pbVar90 = pbVar90 + lVar81;
                      } while (uVar97 != uVar76);
                      break;
                    default:
                      if (iVar91 < 0) {
                        uVar79 = 0;
                        uVar96 = 0;
                      }
                      else {
                        uVar76 = 0;
                        uVar79 = 0;
                        pbVar90 = pbVar101;
                        do {
                          bVar103 = *pbVar90;
                          bVar6 = *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar76 & 7));
                          *(byte *)((long)&local_238[0].data +
                                   (ulong)((int)local_458 + (uint)uVar76 & 7)) = bVar103;
                          uVar79 = (ulong)((int)uVar79 + ((uint)bVar103 - (uint)bVar6));
                          *pbVar90 = (byte)(uVar79 / (local_458 & 0xffffffff));
                          uVar76 = uVar76 + 1;
                          pbVar90 = pbVar90 + lVar81;
                        } while (uVar97 != uVar76);
                      }
                    }
                    if ((int)uVar96 < (int)(uint)uVar113) {
                      uVar76 = (ulong)(int)uVar96;
                      pbVar90 = pbVar101 + lVar81 * uVar76;
                      do {
                        uVar79 = (ulong)((int)uVar79 -
                                        (uint)*(byte *)((long)&local_238[0].data +
                                                       (ulong)((uint)uVar76 & 7)));
                        *pbVar90 = (byte)(uVar79 / (local_458 & 0xffffffff));
                        uVar76 = uVar76 + 1;
                        pbVar90 = pbVar90 + lVar81;
                      } while (uVar113 != uVar76);
                    }
                    pbVar101 = pbVar101 + 1;
                    uVar60 = uVar60 + 1;
                  } while (uVar60 != uVar59);
                  sVar84 = *(short *)(local_368 + 8);
                  uVar51 = *(ushort *)(local_368 + 10);
                  uVar59 = (uint)*(ushort *)(local_368 + 4);
                  uVar113 = *(ushort *)(local_368 + 6);
                }
              }
              *local_2c8 = sVar84;
              local_2c8[1] = uVar51;
              local_2c8[2] = sVar84 + (short)uVar59;
              local_2c8[3] = uVar113 + uVar51;
              *(float *)(local_2c8 + 8) =
                   (float)(int)(short)((short)(local_354 << 8) + (short)local_358) *
                   (float)local_318._0_4_;
              *(ulong *)(local_2c8 + 4) =
                   CONCAT44((float)local_34c * local_268._4_4_ + (float)local_258._4_4_,
                            (float)local_348 * local_268._0_4_ + (float)local_258._0_4_);
              *(float *)(local_2c8 + 10) =
                   (float)(int)(uVar59 + local_348) * local_268._0_4_ + (float)local_258._0_4_;
              *(float *)(local_2c8 + 0xc) =
                   (float)(int)((uint)uVar113 + local_34c) * (float)local_278._0_4_ +
                   (float)local_288._0_4_;
              iVar91 = local_3b8[1].fontstart;
              lVar99 = local_2d0;
              lVar77 = local_370;
              psVar100 = local_3b8;
              auVar119 = _DAT_00192020;
            }
            lVar77 = lVar77 + 1;
          } while (lVar77 < iVar91);
        }
        fVar116 = local_300[local_338].RasterizerMultiply;
        if ((fVar116 != 1.0) || (NAN(fVar116))) {
          lVar99 = 0;
          auVar120 = _DAT_00194310;
          auVar122 = _DAT_00194300;
          auVar125 = _DAT_001942f0;
          auVar127 = _DAT_001942e0;
          do {
            fVar104 = auVar117._0_4_;
            fVar133 = auVar117._4_4_;
            fVar134 = auVar117._8_4_;
            fVar135 = auVar117._12_4_;
            auVar117 = auVar122 & _DAT_00194320 | _DAT_00194330;
            uVar59 = auVar122._4_4_;
            uVar60 = auVar122._8_4_;
            uVar98 = auVar122._12_4_;
            auVar119 = auVar120 & _DAT_00194320 | _DAT_00194330;
            uVar96 = auVar120._4_4_;
            uVar74 = auVar120._8_4_;
            uVar143 = auVar120._12_4_;
            auVar105 = auVar127 & _DAT_00194320 | _DAT_00194330;
            uVar153 = auVar127._4_4_;
            uVar155 = auVar127._8_4_;
            uVar157 = auVar127._12_4_;
            auVar174 = auVar125 & _DAT_00194320 | _DAT_00194330;
            uVar163 = auVar125._4_4_;
            uVar165 = auVar125._8_4_;
            uVar167 = auVar125._12_4_;
            fVar159 = (((float)(auVar125._0_4_ >> 0x10 | 0x53000000) - fVar104) + auVar174._0_4_) *
                      fVar116;
            fVar164 = (((float)(uVar163 >> 0x10 | 0x53000000) - fVar133) + auVar174._4_4_) * fVar116
            ;
            fVar166 = (((float)(uVar165 >> 0x10 | 0x53000000) - fVar134) + auVar174._8_4_) * fVar116
            ;
            fVar168 = (((float)(uVar167 >> 0x10 | 0x53000000) - fVar135) + auVar174._12_4_) *
                      fVar116;
            fVar145 = (((float)(auVar127._0_4_ >> 0x10 | 0x53000000) - fVar104) + auVar105._0_4_) *
                      fVar116;
            fVar154 = (((float)(uVar153 >> 0x10 | 0x53000000) - fVar133) + auVar105._4_4_) * fVar116
            ;
            fVar156 = (((float)(uVar155 >> 0x10 | 0x53000000) - fVar134) + auVar105._8_4_) * fVar116
            ;
            fVar158 = (((float)(uVar157 >> 0x10 | 0x53000000) - fVar135) + auVar105._12_4_) *
                      fVar116;
            fVar137 = (((float)(auVar120._0_4_ >> 0x10 | 0x53000000) - fVar104) + auVar119._0_4_) *
                      fVar116;
            fVar141 = (((float)(uVar96 >> 0x10 | 0x53000000) - fVar133) + auVar119._4_4_) * fVar116;
            fVar142 = (((float)(uVar74 >> 0x10 | 0x53000000) - fVar134) + auVar119._8_4_) * fVar116;
            fVar144 = (((float)(uVar143 >> 0x10 | 0x53000000) - fVar135) + auVar119._12_4_) *
                      fVar116;
            fVar104 = (((float)(auVar122._0_4_ >> 0x10 | 0x53000000) - fVar104) + auVar117._0_4_) *
                      fVar116;
            fVar133 = (((float)(uVar59 >> 0x10 | 0x53000000) - fVar133) + auVar117._4_4_) * fVar116;
            fVar134 = (((float)(uVar60 >> 0x10 | 0x53000000) - fVar134) + auVar117._8_4_) * fVar116;
            fVar135 = (((float)(uVar98 >> 0x10 | 0x53000000) - fVar135) + auVar117._12_4_) * fVar116
            ;
            auVar132._0_4_ = (int)fVar104;
            auVar132._4_4_ = (int)fVar133;
            auVar132._8_4_ = (int)fVar134;
            auVar132._12_4_ = (int)fVar135;
            auVar180._0_4_ = auVar132._0_4_ >> 0x1f;
            auVar180._4_4_ = auVar132._4_4_ >> 0x1f;
            auVar180._8_4_ = auVar132._8_4_ >> 0x1f;
            auVar180._12_4_ = auVar132._12_4_ >> 0x1f;
            auVar131._0_4_ = (int)(fVar104 - 2.1474836e+09);
            auVar131._4_4_ = (int)(fVar133 - 2.1474836e+09);
            auVar131._8_4_ = (int)(fVar134 - 2.1474836e+09);
            auVar131._12_4_ = (int)(fVar135 - 2.1474836e+09);
            auVar132 = auVar131 & auVar180 | auVar132;
            auVar140._0_4_ = (int)fVar137;
            auVar140._4_4_ = (int)fVar141;
            auVar140._8_4_ = (int)fVar142;
            auVar140._12_4_ = (int)fVar144;
            auVar181._0_4_ = auVar140._0_4_ >> 0x1f;
            auVar181._4_4_ = auVar140._4_4_ >> 0x1f;
            auVar181._8_4_ = auVar140._8_4_ >> 0x1f;
            auVar181._12_4_ = auVar140._12_4_ >> 0x1f;
            auVar139._0_4_ = (int)(fVar137 - 2.1474836e+09);
            auVar139._4_4_ = (int)(fVar141 - 2.1474836e+09);
            auVar139._8_4_ = (int)(fVar142 - 2.1474836e+09);
            auVar139._12_4_ = (int)(fVar144 - 2.1474836e+09);
            auVar140 = auVar139 & auVar181 | auVar140;
            auVar176._0_4_ = (int)fVar145;
            auVar176._4_4_ = (int)fVar154;
            auVar176._8_4_ = (int)fVar156;
            auVar176._12_4_ = (int)fVar158;
            auVar184._0_4_ = auVar176._0_4_ >> 0x1f;
            auVar184._4_4_ = auVar176._4_4_ >> 0x1f;
            auVar184._8_4_ = auVar176._8_4_ >> 0x1f;
            auVar184._12_4_ = auVar176._12_4_ >> 0x1f;
            auVar175._0_4_ = (int)(fVar145 - 2.1474836e+09);
            auVar175._4_4_ = (int)(fVar154 - 2.1474836e+09);
            auVar175._8_4_ = (int)(fVar156 - 2.1474836e+09);
            auVar175._12_4_ = (int)(fVar158 - 2.1474836e+09);
            auVar176 = auVar175 & auVar184 | auVar176;
            auVar161._0_4_ = (int)fVar159;
            auVar161._4_4_ = (int)fVar164;
            auVar161._8_4_ = (int)fVar166;
            auVar161._12_4_ = (int)fVar168;
            auVar182._0_4_ = auVar161._0_4_ >> 0x1f;
            auVar182._4_4_ = auVar161._4_4_ >> 0x1f;
            auVar182._8_4_ = auVar161._8_4_ >> 0x1f;
            auVar182._12_4_ = auVar161._12_4_ >> 0x1f;
            auVar160._0_4_ = (int)(fVar159 - 2.1474836e+09);
            auVar160._4_4_ = (int)(fVar164 - 2.1474836e+09);
            auVar160._8_4_ = (int)(fVar166 - 2.1474836e+09);
            auVar160._12_4_ = (int)(fVar168 - 2.1474836e+09);
            auVar161 = auVar160 & auVar182 | auVar161;
            auVar117 = auVar161 ^ _DAT_00192020;
            auVar151._0_4_ = -(uint)(auVar117._0_4_ < -0x7fffff01);
            auVar151._4_4_ = -(uint)(auVar117._4_4_ < -0x7fffff01);
            auVar151._8_4_ = -(uint)(auVar117._8_4_ < -0x7fffff01);
            auVar151._12_4_ = -(uint)(auVar117._12_4_ < -0x7fffff01);
            auVar117 = ~auVar151 & auVar126 | auVar161 & auVar151;
            auVar119 = auVar176 ^ _DAT_00192020;
            auVar183._0_4_ = -(uint)(auVar119._0_4_ < -0x7fffff01);
            auVar183._4_4_ = -(uint)(auVar119._4_4_ < -0x7fffff01);
            auVar183._8_4_ = -(uint)(auVar119._8_4_ < -0x7fffff01);
            auVar183._12_4_ = -(uint)(auVar119._12_4_ < -0x7fffff01);
            auVar119 = ~auVar183 & auVar126 | auVar176 & auVar183;
            sVar84 = auVar117._0_2_;
            cVar12 = (0 < sVar84) * (sVar84 < 0x100) * auVar117[0] - (0xff < sVar84);
            sVar84 = auVar117._2_2_;
            sVar52 = CONCAT11((0 < sVar84) * (sVar84 < 0x100) * auVar117[2] - (0xff < sVar84),cVar12
                             );
            sVar84 = auVar117._4_2_;
            cVar111 = (0 < sVar84) * (sVar84 < 0x100) * auVar117[4] - (0xff < sVar84);
            sVar84 = auVar117._6_2_;
            uVar146 = CONCAT13((0 < sVar84) * (sVar84 < 0x100) * auVar117[6] - (0xff < sVar84),
                               CONCAT12(cVar111,sVar52));
            sVar84 = auVar117._8_2_;
            cVar13 = (0 < sVar84) * (sVar84 < 0x100) * auVar117[8] - (0xff < sVar84);
            sVar84 = auVar117._10_2_;
            uVar147 = CONCAT15((0 < sVar84) * (sVar84 < 0x100) * auVar117[10] - (0xff < sVar84),
                               CONCAT14(cVar13,uVar146));
            sVar84 = auVar117._12_2_;
            cVar14 = (0 < sVar84) * (sVar84 < 0x100) * auVar117[0xc] - (0xff < sVar84);
            sVar84 = auVar117._14_2_;
            uVar148 = CONCAT17((0 < sVar84) * (sVar84 < 0x100) * auVar117[0xe] - (0xff < sVar84),
                               CONCAT16(cVar14,uVar147));
            sVar84 = auVar119._0_2_;
            cVar15 = (0 < sVar84) * (sVar84 < 0x100) * auVar119[0] - (0xff < sVar84);
            sVar84 = auVar119._2_2_;
            auVar149._0_10_ =
                 CONCAT19((0 < sVar84) * (sVar84 < 0x100) * auVar119[2] - (0xff < sVar84),
                          CONCAT18(cVar15,uVar148));
            sVar84 = auVar119._4_2_;
            cVar16 = (0 < sVar84) * (sVar84 < 0x100) * auVar119[4] - (0xff < sVar84);
            auVar149[10] = cVar16;
            sVar84 = auVar119._6_2_;
            auVar149[0xb] = (0 < sVar84) * (sVar84 < 0x100) * auVar119[6] - (0xff < sVar84);
            sVar84 = auVar119._8_2_;
            cVar114 = (0 < sVar84) * (sVar84 < 0x100) * auVar119[8] - (0xff < sVar84);
            auVar150[0xc] = cVar114;
            auVar150._0_12_ = auVar149;
            sVar84 = auVar119._10_2_;
            auVar150[0xd] = (0 < sVar84) * (sVar84 < 0x100) * auVar119[10] - (0xff < sVar84);
            sVar84 = auVar119._12_2_;
            cVar112 = (0 < sVar84) * (sVar84 < 0x100) * auVar119[0xc] - (0xff < sVar84);
            auVar152[0xe] = cVar112;
            auVar152._0_14_ = auVar150;
            sVar84 = auVar119._14_2_;
            auVar152[0xf] = (0 < sVar84) * (sVar84 < 0x100) * auVar119[0xe] - (0xff < sVar84);
            auVar117 = auVar140 ^ _DAT_00192020;
            auVar177._0_4_ = -(uint)(auVar117._0_4_ < -0x7fffff01);
            auVar177._4_4_ = -(uint)(auVar117._4_4_ < -0x7fffff01);
            auVar177._8_4_ = -(uint)(auVar117._8_4_ < -0x7fffff01);
            auVar177._12_4_ = -(uint)(auVar117._12_4_ < -0x7fffff01);
            auVar119 = ~auVar177 & auVar126 | auVar140 & auVar177;
            auVar117 = auVar132 ^ _DAT_00192020;
            auVar162._0_4_ = -(uint)(auVar117._0_4_ < -0x7fffff01);
            auVar162._4_4_ = -(uint)(auVar117._4_4_ < -0x7fffff01);
            auVar162._8_4_ = -(uint)(auVar117._8_4_ < -0x7fffff01);
            auVar162._12_4_ = -(uint)(auVar117._12_4_ < -0x7fffff01);
            auVar117 = ~auVar162 & auVar126 | auVar132 & auVar162;
            sVar84 = auVar119._0_2_;
            cVar17 = (0 < sVar84) * (sVar84 < 0x100) * auVar119[0] - (0xff < sVar84);
            sVar84 = auVar119._2_2_;
            sVar115 = CONCAT11((0 < sVar84) * (sVar84 < 0x100) * auVar119[2] - (0xff < sVar84),
                               cVar17);
            sVar84 = auVar119._4_2_;
            cVar18 = (0 < sVar84) * (sVar84 < 0x100) * auVar119[4] - (0xff < sVar84);
            sVar84 = auVar119._6_2_;
            uVar169 = CONCAT13((0 < sVar84) * (sVar84 < 0x100) * auVar119[6] - (0xff < sVar84),
                               CONCAT12(cVar18,sVar115));
            sVar84 = auVar119._8_2_;
            cVar19 = (0 < sVar84) * (sVar84 < 0x100) * auVar119[8] - (0xff < sVar84);
            sVar84 = auVar119._10_2_;
            uVar170 = CONCAT15((0 < sVar84) * (sVar84 < 0x100) * auVar119[10] - (0xff < sVar84),
                               CONCAT14(cVar19,uVar169));
            sVar84 = auVar119._12_2_;
            cVar20 = (0 < sVar84) * (sVar84 < 0x100) * auVar119[0xc] - (0xff < sVar84);
            sVar84 = auVar119._14_2_;
            uVar171 = CONCAT17((0 < sVar84) * (sVar84 < 0x100) * auVar119[0xe] - (0xff < sVar84),
                               CONCAT16(cVar20,uVar170));
            sVar84 = auVar117._0_2_;
            cVar21 = (0 < sVar84) * (sVar84 < 0x100) * auVar117[0] - (0xff < sVar84);
            sVar84 = auVar117._2_2_;
            auVar172._0_10_ =
                 CONCAT19((0 < sVar84) * (sVar84 < 0x100) * auVar117[2] - (0xff < sVar84),
                          CONCAT18(cVar21,uVar171));
            sVar84 = auVar117._4_2_;
            cVar22 = (0 < sVar84) * (sVar84 < 0x100) * auVar117[4] - (0xff < sVar84);
            auVar172[10] = cVar22;
            sVar84 = auVar117._6_2_;
            auVar172[0xb] = (0 < sVar84) * (sVar84 < 0x100) * auVar117[6] - (0xff < sVar84);
            sVar84 = auVar117._8_2_;
            cVar23 = (0 < sVar84) * (sVar84 < 0x100) * auVar117[8] - (0xff < sVar84);
            auVar173[0xc] = cVar23;
            auVar173._0_12_ = auVar172;
            sVar84 = auVar117._10_2_;
            auVar173[0xd] = (0 < sVar84) * (sVar84 < 0x100) * auVar117[10] - (0xff < sVar84);
            sVar84 = auVar117._12_2_;
            cVar24 = (0 < sVar84) * (sVar84 < 0x100) * auVar117[0xc] - (0xff < sVar84);
            auVar178[0xe] = cVar24;
            auVar178._0_14_ = auVar173;
            sVar84 = auVar117._14_2_;
            auVar178[0xf] = (0 < sVar84) * (sVar84 < 0x100) * auVar117[0xe] - (0xff < sVar84);
            sVar84 = (short)((uint)uVar169 >> 0x10);
            auVar179[1] = (0 < sVar84) * (sVar84 < 0x100) * cVar18 - (0xff < sVar84);
            auVar179[0] = (0 < sVar115) * (sVar115 < 0x100) * cVar17 - (0xff < sVar115);
            sVar84 = (short)((uint6)uVar170 >> 0x20);
            auVar179[2] = (0 < sVar84) * (sVar84 < 0x100) * cVar19 - (0xff < sVar84);
            sVar84 = (short)((ulong)uVar171 >> 0x30);
            auVar179[3] = (0 < sVar84) * (sVar84 < 0x100) * cVar20 - (0xff < sVar84);
            sVar84 = (short)((unkuint10)auVar172._0_10_ >> 0x40);
            auVar179[4] = (0 < sVar84) * (sVar84 < 0x100) * cVar21 - (0xff < sVar84);
            sVar84 = auVar172._10_2_;
            auVar179[5] = (0 < sVar84) * (sVar84 < 0x100) * cVar22 - (0xff < sVar84);
            sVar84 = auVar173._12_2_;
            auVar179[6] = (0 < sVar84) * (sVar84 < 0x100) * cVar23 - (0xff < sVar84);
            sVar84 = auVar178._14_2_;
            auVar179[7] = (0 < sVar84) * (sVar84 < 0x100) * cVar24 - (0xff < sVar84);
            auVar179[8] = (0 < sVar52) * (sVar52 < 0x100) * cVar12 - (0xff < sVar52);
            sVar84 = (short)((uint)uVar146 >> 0x10);
            auVar179[9] = (0 < sVar84) * (sVar84 < 0x100) * cVar111 - (0xff < sVar84);
            sVar84 = (short)((uint6)uVar147 >> 0x20);
            auVar179[10] = (0 < sVar84) * (sVar84 < 0x100) * cVar13 - (0xff < sVar84);
            sVar84 = (short)((ulong)uVar148 >> 0x30);
            auVar179[0xb] = (0 < sVar84) * (sVar84 < 0x100) * cVar14 - (0xff < sVar84);
            sVar84 = (short)((unkuint10)auVar149._0_10_ >> 0x40);
            auVar179[0xc] = (0 < sVar84) * (sVar84 < 0x100) * cVar15 - (0xff < sVar84);
            sVar84 = auVar149._10_2_;
            auVar179[0xd] = (0 < sVar84) * (sVar84 < 0x100) * cVar16 - (0xff < sVar84);
            sVar84 = auVar150._12_2_;
            auVar179[0xe] = (0 < sVar84) * (sVar84 < 0x100) * cVar114 - (0xff < sVar84);
            sVar84 = auVar152._14_2_;
            auVar179[0xf] = (0 < sVar84) * (sVar84 < 0x100) * cVar112 - (0xff < sVar84);
            *(undefined1 (*) [16])((long)&local_238[0].data + lVar99) = auVar179;
            lVar99 = lVar99 + 0x10;
            iVar91 = (int)DAT_00194390;
            auVar120._0_4_ = auVar120._0_4_ + iVar91;
            iVar61 = DAT_00194390._4_4_;
            auVar120._4_4_ = uVar96 + iVar61;
            iVar62 = DAT_00194390._8_4_;
            auVar120._8_4_ = uVar74 + iVar62;
            iVar136 = DAT_00194390._12_4_;
            auVar120._12_4_ = uVar143 + iVar136;
            auVar122._0_4_ = auVar122._0_4_ + iVar91;
            auVar122._4_4_ = uVar59 + iVar61;
            auVar122._8_4_ = uVar60 + iVar62;
            auVar122._12_4_ = uVar98 + iVar136;
            auVar125._0_4_ = auVar125._0_4_ + iVar91;
            auVar125._4_4_ = uVar163 + iVar61;
            auVar125._8_4_ = uVar165 + iVar62;
            auVar125._12_4_ = uVar167 + iVar136;
            auVar127._0_4_ = auVar127._0_4_ + iVar91;
            auVar127._4_4_ = uVar153 + iVar61;
            auVar127._8_4_ = uVar155 + iVar62;
            auVar127._12_4_ = uVar157 + iVar136;
            auVar117 = _DAT_00194350;
          } while (lVar99 != 0x100);
          iVar91 = psVar100[1].cff.cursor;
          auVar119 = _DAT_00192020;
          auVar117 = _DAT_00194350;
          if (0 < iVar91) {
            lVar77._0_4_ = psVar100[1].hmtx;
            lVar77._4_4_ = psVar100[1].kern;
            iVar61 = 0;
            do {
              if ((*(int *)(lVar77 + 0xc) != 0) && (*(ushort *)(lVar77 + 6) != 0)) {
                iVar91 = atlas->TexWidth;
                uVar51 = *(ushort *)(lVar77 + 4);
                puVar66 = atlas->TexPixelsAlpha8 +
                          (ulong)*(ushort *)(lVar77 + 10) * (long)iVar91 +
                          (ulong)*(ushort *)(lVar77 + 8);
                uVar59 = (uint)*(ushort *)(lVar77 + 6);
                do {
                  if ((ulong)uVar51 != 0) {
                    uVar97 = 0;
                    do {
                      puVar66[uVar97] =
                           *(uchar *)((long)&local_238[0].data + (ulong)puVar66[uVar97]);
                      uVar97 = uVar97 + 1;
                    } while (uVar51 != uVar97);
                  }
                  puVar66 = puVar66 + iVar91;
                  bVar102 = 1 < (int)uVar59;
                  uVar59 = uVar59 - 1;
                } while (bVar102);
                iVar91 = psVar100[1].cff.cursor;
              }
              iVar61 = iVar61 + 1;
              lVar77 = lVar77 + 0x10;
            } while (iVar61 < iVar91);
          }
        }
        psVar100[1].hmtx = 0;
        psVar100[1].kern = 0;
      }
      lVar99 = local_338 + 1;
    } while (lVar99 < (int)local_3f8);
  }
  ImGui::MemFree(local_468);
  ImGui::MemFree(local_340);
  pvVar67 = pvStack_400;
  if (pvStack_400 != (void *)0x0) {
    auVar42._8_8_ = 0;
    auVar42._0_8_ = pvStack_400;
    _local_408 = (stbtt__buf)(auVar42 << 0x40);
    ImGui::MemFree(pvVar67);
    pvStack_400._0_4_ = 0;
    pvStack_400._4_4_ = 0;
  }
  iVar78 = (int)local_3f8;
  uVar97 = (ulong)(int)local_3f8;
  if (0 < (long)uVar97) {
    local_438._0_8_ = pvStack_3f0;
    uVar79 = 0;
    auVar110._0_12_ = DAT_001942d0._0_12_;
    auVar110._12_2_ = DAT_001942d0._6_2_;
    auVar110._14_2_ = DAT_001942d0._6_2_;
    auVar109._12_4_ = auVar110._12_4_;
    auVar109._0_10_ = (unkbyte10)DAT_001942d0;
    auVar109._10_2_ = DAT_001942d0._4_2_;
    auVar108._10_6_ = auVar109._10_6_;
    auVar108._0_8_ = (undefined8)DAT_001942d0;
    auVar108._8_2_ = DAT_001942d0._4_2_;
    local_448._8_8_ = auVar108._8_8_;
    local_448._6_2_ = DAT_001942d0._2_2_;
    local_448._4_2_ = DAT_001942d0._2_2_;
    local_448._0_2_ = (undefined2)DAT_001942d0;
    local_448._2_2_ = local_448._0_2_;
    do {
      iVar91 = *(int *)(local_438._0_8_ + 0xe8 + uVar79 * 0x110);
      if (iVar91 != 0) {
        lVar99 = uVar79 * 0x110 + local_438._0_8_;
        pIVar11 = (atlas->ConfigData).Data;
        pIVar92 = pIVar11 + uVar79;
        pIVar10 = pIVar11[uVar79].DstFont;
        if (pIVar11[uVar79].MergeMode == true) {
          fVar116 = pIVar10->Ascent;
        }
        else {
          fVar104 = pIVar11[uVar79].SizePixels;
          lVar81 = *(long *)(lVar99 + 8);
          lVar77 = (long)*(int *)(lVar99 + 0x24);
          bVar103 = *(byte *)(lVar81 + 4 + lVar77);
          bVar6 = *(byte *)(lVar81 + 5 + lVar77);
          bVar7 = *(byte *)(lVar81 + 7 + lVar77);
          bVar8 = *(byte *)(lVar81 + 6 + lVar77);
          ImFont::ClearOutputData(pIVar10);
          iVar91 = (uint)bVar8 * 0x100 + (uint)bVar103;
          auVar31._1_9_ = (unkuint9)0 << 8;
          auVar31[0] = (char)((uint)iVar91 >> 0x10);
          auVar31._10_6_ = 0;
          auVar46._1_12_ = SUB1612(auVar31 << 0x28,4);
          auVar46[0] = (char)((uint)iVar91 >> 8);
          auVar46[0xd] = 0;
          auVar47._1_14_ = auVar46 << 8;
          auVar47[0] = (char)iVar91;
          auVar47[0xf] = 0;
          auVar117 = ZEXT416((uint)bVar6 | (uint)bVar7 << 0x10) | auVar47 << 8;
          sVar52 = auVar117._0_2_;
          sVar84 = auVar117._2_2_;
          fVar133 = (float)((int)sVar52 - (int)sVar84);
          sVar115 = auVar117._4_2_;
          auVar48._4_6_ = 0;
          auVar48._0_4_ = fVar133;
          auVar48._10_2_ = sVar115;
          auVar49._8_4_ = auVar48._8_4_;
          auVar49._6_2_ = sVar84;
          auVar49._4_2_ = (short)((uint)fVar133 >> 0x10);
          auVar49._0_4_ = fVar133;
          auVar123._0_2_ = -(ushort)(sVar52 < (short)local_448._0_2_);
          auVar123._2_2_ = -(ushort)(sVar52 < (short)local_448._2_2_);
          auVar123._4_2_ = -(ushort)(sVar84 < (short)local_448._4_2_);
          auVar123._6_2_ = -(ushort)(sVar84 < (short)local_448._6_2_);
          auVar123._8_2_ = -(ushort)(sVar115 < (short)local_448._8_2_);
          auVar123._10_2_ = -(ushort)(sVar115 < (short)local_448._10_2_);
          auVar123._12_2_ = -(ushort)(0 < (short)local_448._12_2_);
          auVar123._14_2_ = -(ushort)(0 < (short)local_448._14_2_);
          auVar117 = auVar123 & _DAT_00192b00 | ~auVar123 & _DAT_00192a80;
          fVar116 = (float)(int)((fVar104 / fVar133) * (float)(int)sVar52 + auVar117._0_4_);
          pIVar10->FontSize = pIVar92->SizePixels;
          pIVar10->ConfigData = pIVar92;
          pIVar10->ContainerAtlas = atlas;
          pIVar10->Ascent = fVar116;
          pIVar10->Descent =
               (float)(int)((fVar104 / fVar133) * (float)(auVar49._4_4_ >> 0x10) + auVar117._4_4_);
          iVar91 = *(int *)(lVar99 + 0xe8);
        }
        pIVar10->ConfigDataCount = pIVar10->ConfigDataCount + 1;
        if (0 < iVar91) {
          fVar104 = (pIVar92->GlyphOffset).x;
          fVar116 = (float)(int)(fVar116 + 0.5) + (pIVar92->GlyphOffset).y;
          lVar81 = 0;
          lVar77 = 0;
          do {
            lVar68 = *(long *)(lVar99 + 0xd0);
            fVar133 = *(float *)(lVar68 + 0x10 + lVar81);
            fVar134 = pIVar92->GlyphMaxAdvanceX;
            if (fVar133 <= pIVar92->GlyphMaxAdvanceX) {
              fVar134 = fVar133;
            }
            uVar59 = -(uint)(fVar133 < pIVar92->GlyphMinAdvanceX);
            fVar134 = (float)(uVar59 & (uint)pIVar92->GlyphMinAdvanceX | ~uVar59 & (uint)fVar134);
            if ((fVar133 != fVar134) || (fVar135 = fVar104, NAN(fVar133) || NAN(fVar134))) {
              fVar135 = (fVar134 - fVar133) * 0.5;
              if (pIVar92->PixelSnapH != false) {
                fVar135 = (float)(int)fVar135;
              }
              fVar135 = fVar135 + fVar104;
            }
            fVar137 = 1.0 / (float)atlas->TexHeight;
            fVar133 = 1.0 / (float)atlas->TexWidth;
            ImFont::AddGlyph(pIVar10,(ImWchar)*(undefined4 *)
                                               (*(long *)(lVar99 + 0x108) + lVar77 * 4),
                             *(float *)(lVar68 + 8 + lVar81) + 0.0 + fVar135,
                             *(float *)(lVar68 + 0xc + lVar81) + 0.0 + fVar116,
                             *(float *)(lVar68 + 0x14 + lVar81) + 0.0 + fVar135,
                             *(float *)(lVar68 + 0x18 + lVar81) + 0.0 + fVar116,
                             (float)*(ushort *)(lVar68 + lVar81) * fVar133,
                             (float)*(ushort *)(lVar68 + 2 + lVar81) * fVar137,
                             (float)*(ushort *)(lVar68 + 4 + lVar81) * fVar133,
                             (float)*(ushort *)(lVar68 + 6 + lVar81) * fVar137,fVar134);
            lVar77 = lVar77 + 1;
            lVar81 = lVar81 + 0x1c;
          } while (lVar77 < *(int *)(lVar99 + 0xe8));
        }
      }
      uVar79 = uVar79 + 1;
    } while (uVar79 < uVar97);
    if (0 < iVar78) {
      puVar80 = (undefined8 *)((long)pvStack_3f0 + 0x108);
      uVar79 = 0;
      do {
        if ((void *)*puVar80 != (void *)0x0) {
          ImGui::MemFree((void *)*puVar80);
        }
        if ((void *)puVar80[-2] != (void *)0x0) {
          ImGui::MemFree((void *)puVar80[-2]);
        }
        uVar79 = uVar79 + 1;
        puVar80 = puVar80 + 0x22;
      } while (uVar79 < uVar97);
    }
  }
  ImFontAtlasBuildFinish(atlas);
  if (pvStack_3a0 != (void *)0x0) {
    ImGui::MemFree(pvStack_3a0);
  }
  bVar102 = true;
LAB_0013adef:
  if (pvStack_3c0 != (void *)0x0) {
    ImGui::MemFree(pvStack_3c0);
  }
  if (pvStack_3f0 != (void *)0x0) {
    ImGui::MemFree(pvStack_3f0);
  }
  return bVar102;
}

Assistant:

bool    ImFontAtlasBuildWithStbTruetype(ImFontAtlas* atlas)
{
    IM_ASSERT(atlas->ConfigData.Size > 0);

    ImFontAtlasBuildRegisterDefaultCustomRects(atlas);

    // Clear atlas
    atlas->TexID = (ImTextureID)NULL;
    atlas->TexWidth = atlas->TexHeight = 0;
    atlas->TexUvScale = ImVec2(0.0f, 0.0f);
    atlas->TexUvWhitePixel = ImVec2(0.0f, 0.0f);
    atlas->ClearTexData();

    // Temporary storage for building
    ImVector<ImFontBuildSrcData> src_tmp_array;
    ImVector<ImFontBuildDstData> dst_tmp_array;
    src_tmp_array.resize(atlas->ConfigData.Size);
    dst_tmp_array.resize(atlas->Fonts.Size);
    memset(src_tmp_array.Data, 0, (size_t)src_tmp_array.size_in_bytes());
    memset(dst_tmp_array.Data, 0, (size_t)dst_tmp_array.size_in_bytes());

    // 1. Initialize font loading structure, check font data validity
    for (int src_i = 0; src_i < atlas->ConfigData.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        IM_ASSERT(cfg.DstFont && (!cfg.DstFont->IsLoaded() || cfg.DstFont->ContainerAtlas == atlas));

        // Find index from cfg.DstFont (we allow the user to set cfg.DstFont. Also it makes casual debugging nicer than when storing indices)
        src_tmp.DstIndex = -1;
        for (int output_i = 0; output_i < atlas->Fonts.Size && src_tmp.DstIndex == -1; output_i++)
            if (cfg.DstFont == atlas->Fonts[output_i])
                src_tmp.DstIndex = output_i;
        IM_ASSERT(src_tmp.DstIndex != -1); // cfg.DstFont not pointing within atlas->Fonts[] array?
        if (src_tmp.DstIndex == -1)
            return false;

        // Initialize helper structure for font loading and verify that the TTF/OTF data is correct
        const int font_offset = stbtt_GetFontOffsetForIndex((unsigned char*)cfg.FontData, cfg.FontNo);
        IM_ASSERT(font_offset >= 0 && "FontData is incorrect, or FontNo cannot be found.");
        if (!stbtt_InitFont(&src_tmp.FontInfo, (unsigned char*)cfg.FontData, font_offset))
            return false;

        // Measure highest codepoints
        ImFontBuildDstData& dst_tmp = dst_tmp_array[src_tmp.DstIndex];
        src_tmp.SrcRanges = cfg.GlyphRanges ? cfg.GlyphRanges : atlas->GetGlyphRangesDefault();
        for (const ImWchar* src_range = src_tmp.SrcRanges; src_range[0] && src_range[1]; src_range += 2)
            src_tmp.GlyphsHighest = ImMax(src_tmp.GlyphsHighest, (int)src_range[1]);
        dst_tmp.SrcCount++;
        dst_tmp.GlyphsHighest = ImMax(dst_tmp.GlyphsHighest, src_tmp.GlyphsHighest);
    }

    // 2. For every requested codepoint, check for their presence in the font data, and handle redundancy or overlaps between source fonts to avoid unused glyphs.
    int total_glyphs_count = 0;
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        ImFontBuildDstData& dst_tmp = dst_tmp_array[src_tmp.DstIndex];
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        src_tmp.GlyphsSet.Resize(src_tmp.GlyphsHighest + 1);
        if (dst_tmp.SrcCount > 1 && dst_tmp.GlyphsSet.Storage.empty())
            dst_tmp.GlyphsSet.Resize(dst_tmp.GlyphsHighest + 1);

        for (const ImWchar* src_range = src_tmp.SrcRanges; src_range[0] && src_range[1]; src_range += 2)
            for (int codepoint = src_range[0]; codepoint <= src_range[1]; codepoint++)
            {
                if (cfg.MergeMode && dst_tmp.GlyphsSet.GetBit(codepoint))   // Don't overwrite existing glyphs. We could make this an option (e.g. MergeOverwrite)
                    continue;
                if (!stbtt_FindGlyphIndex(&src_tmp.FontInfo, codepoint))    // It is actually in the font?
                    continue;
                
                // Add to avail set/counters
                src_tmp.GlyphsCount++;
                dst_tmp.GlyphsCount++;
                src_tmp.GlyphsSet.SetBit(codepoint, true);
                if (dst_tmp.SrcCount > 1)
                    dst_tmp.GlyphsSet.SetBit(codepoint, true);
                total_glyphs_count++;
            }
    }

    // 3. Unpack our bit map into a flat list (we now have all the Unicode points that we know are requested _and_ available _and_ not overlapping another)
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        src_tmp.GlyphsList.reserve(src_tmp.GlyphsCount);
        UnpackBoolVectorToFlatIndexList(&src_tmp.GlyphsSet, &src_tmp.GlyphsList);
        src_tmp.GlyphsSet.Clear();
        IM_ASSERT(src_tmp.GlyphsList.Size == src_tmp.GlyphsCount);
    }
    for (int dst_i = 0; dst_i < dst_tmp_array.Size; dst_i++)
        dst_tmp_array[dst_i].GlyphsSet.Clear();
    dst_tmp_array.clear();

    // Allocate packing character data and flag packed characters buffer as non-packed (x0=y0=x1=y1=0)
    // (We technically don't need to zero-clear buf_rects, but let's do it for the sake of sanity)
    ImVector<stbrp_rect> buf_rects;
    ImVector<stbtt_packedchar> buf_packedchars;
    buf_rects.resize(total_glyphs_count);
    buf_packedchars.resize(total_glyphs_count);
    memset(buf_rects.Data, 0, (size_t)buf_rects.size_in_bytes());
    memset(buf_packedchars.Data, 0, (size_t)buf_packedchars.size_in_bytes());

    // 4. Gather glyphs sizes so we can pack them in our virtual canvas.
    int total_surface = 0;
    int buf_rects_out_n = 0;
    int buf_packedchars_out_n = 0;
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        src_tmp.Rects = &buf_rects[buf_rects_out_n];
        src_tmp.PackedChars = &buf_packedchars[buf_packedchars_out_n];
        buf_rects_out_n += src_tmp.GlyphsCount;
        buf_packedchars_out_n += src_tmp.GlyphsCount;

        // Convert our ranges in the format stb_truetype wants
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        src_tmp.PackRange.font_size = cfg.SizePixels;
        src_tmp.PackRange.first_unicode_codepoint_in_range = 0;
        src_tmp.PackRange.array_of_unicode_codepoints = src_tmp.GlyphsList.Data;
        src_tmp.PackRange.num_chars = src_tmp.GlyphsList.Size;
        src_tmp.PackRange.chardata_for_range = src_tmp.PackedChars;
        src_tmp.PackRange.h_oversample = (unsigned char)cfg.OversampleH;
        src_tmp.PackRange.v_oversample = (unsigned char)cfg.OversampleV;

        // Gather the sizes of all rectangles we will need to pack (this loop is based on stbtt_PackFontRangesGatherRects)
        const float scale = (cfg.SizePixels > 0) ? stbtt_ScaleForPixelHeight(&src_tmp.FontInfo, cfg.SizePixels) : stbtt_ScaleForMappingEmToPixels(&src_tmp.FontInfo, -cfg.SizePixels);
        const int padding = atlas->TexGlyphPadding;
        for (int glyph_i = 0; glyph_i < src_tmp.GlyphsList.Size; glyph_i++)
        {
            int x0, y0, x1, y1;
            const int glyph_index_in_font = stbtt_FindGlyphIndex(&src_tmp.FontInfo, src_tmp.GlyphsList[glyph_i]);
            IM_ASSERT(glyph_index_in_font != 0);
            stbtt_GetGlyphBitmapBoxSubpixel(&src_tmp.FontInfo, glyph_index_in_font, scale * cfg.OversampleH, scale * cfg.OversampleV, 0, 0, &x0, &y0, &x1, &y1);
            src_tmp.Rects[glyph_i].w = (stbrp_coord)(x1 - x0 + padding + cfg.OversampleH - 1);
            src_tmp.Rects[glyph_i].h = (stbrp_coord)(y1 - y0 + padding + cfg.OversampleV - 1);
            total_surface += src_tmp.Rects[glyph_i].w * src_tmp.Rects[glyph_i].h;
        }
    }

    // We need a width for the skyline algorithm, any width!
    // The exact width doesn't really matter much, but some API/GPU have texture size limitations and increasing width can decrease height.
    // User can override TexDesiredWidth and TexGlyphPadding if they wish, otherwise we use a simple heuristic to select the width based on expected surface.
    const int surface_sqrt = (int)ImSqrt((float)total_surface) + 1;
    atlas->TexHeight = 0;
    if (atlas->TexDesiredWidth > 0)
        atlas->TexWidth = atlas->TexDesiredWidth;
    else
        atlas->TexWidth = (surface_sqrt >= 4096*0.7f) ? 4096 : (surface_sqrt >= 2048*0.7f) ? 2048 : (surface_sqrt >= 1024*0.7f) ? 1024 : 512;

    // 5. Start packing
    // Pack our extra data rectangles first, so it will be on the upper-left corner of our texture (UV will have small values).
    const int TEX_HEIGHT_MAX = 1024 * 32;
    stbtt_pack_context spc = {};
    stbtt_PackBegin(&spc, NULL, atlas->TexWidth, TEX_HEIGHT_MAX, 0, atlas->TexGlyphPadding, NULL);
    ImFontAtlasBuildPackCustomRects(atlas, spc.pack_info);

    // 6. Pack each source font. No rendering yet, we are working with rectangles in an infinitely tall texture at this point.
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        stbrp_pack_rects((stbrp_context*)spc.pack_info, src_tmp.Rects, src_tmp.GlyphsCount);

        // Extend texture height and mark missing glyphs as non-packed so we won't render them.
        // FIXME: We are not handling packing failure here (would happen if we got off TEX_HEIGHT_MAX or if a single if larger than TexWidth?)
        for (int glyph_i = 0; glyph_i < src_tmp.GlyphsCount; glyph_i++)
            if (src_tmp.Rects[glyph_i].was_packed)
                atlas->TexHeight = ImMax(atlas->TexHeight, src_tmp.Rects[glyph_i].y + src_tmp.Rects[glyph_i].h);
    }

    // 7. Allocate texture
    atlas->TexHeight = (atlas->Flags & ImFontAtlasFlags_NoPowerOfTwoHeight) ? (atlas->TexHeight + 1) : ImUpperPowerOfTwo(atlas->TexHeight);
    atlas->TexUvScale = ImVec2(1.0f / atlas->TexWidth, 1.0f / atlas->TexHeight);
    atlas->TexPixelsAlpha8 = (unsigned char*)ImGui::MemAlloc(atlas->TexWidth * atlas->TexHeight);
    memset(atlas->TexPixelsAlpha8, 0, atlas->TexWidth * atlas->TexHeight);
    spc.pixels = atlas->TexPixelsAlpha8;
    spc.height = atlas->TexHeight;

    // 8. Render/rasterize font characters into the texture
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        stbtt_PackFontRangesRenderIntoRects(&spc, &src_tmp.FontInfo, &src_tmp.PackRange, 1, src_tmp.Rects);

        // Apply multiply operator
        if (cfg.RasterizerMultiply != 1.0f)
        {
            unsigned char multiply_table[256];
            ImFontAtlasBuildMultiplyCalcLookupTable(multiply_table, cfg.RasterizerMultiply);
            stbrp_rect* r = &src_tmp.Rects[0];
            for (int glyph_i = 0; glyph_i < src_tmp.GlyphsCount; glyph_i++, r++)
                if (r->was_packed)
                    ImFontAtlasBuildMultiplyRectAlpha8(multiply_table, atlas->TexPixelsAlpha8, r->x, r->y, r->w, r->h, atlas->TexWidth * 1);
        }
        src_tmp.Rects = NULL;
    }

    // End packing
    stbtt_PackEnd(&spc);
    buf_rects.clear();

    // 9. Setup ImFont and glyphs for runtime
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        ImFontConfig& cfg = atlas->ConfigData[src_i];
        ImFont* dst_font = cfg.DstFont; // We can have multiple input fonts writing into a same destination font (when using MergeMode=true)

        const float font_scale = stbtt_ScaleForPixelHeight(&src_tmp.FontInfo, cfg.SizePixels);
        int unscaled_ascent, unscaled_descent, unscaled_line_gap;
        stbtt_GetFontVMetrics(&src_tmp.FontInfo, &unscaled_ascent, &unscaled_descent, &unscaled_line_gap);

        const float ascent = ImFloor(unscaled_ascent * font_scale + ((unscaled_ascent > 0.0f) ? +1 : -1));
        const float descent = ImFloor(unscaled_descent * font_scale + ((unscaled_descent > 0.0f) ? +1 : -1));
        ImFontAtlasBuildSetupFont(atlas, dst_font, &cfg, ascent, descent);
        const float font_off_x = cfg.GlyphOffset.x;
        const float font_off_y = cfg.GlyphOffset.y + (float)(int)(dst_font->Ascent + 0.5f);

        for (int glyph_i = 0; glyph_i < src_tmp.GlyphsCount; glyph_i++)
        {
            const int codepoint = src_tmp.GlyphsList[glyph_i];
            const stbtt_packedchar& pc = src_tmp.PackedChars[glyph_i];

            const float char_advance_x_org = pc.xadvance;
            const float char_advance_x_mod = ImClamp(char_advance_x_org, cfg.GlyphMinAdvanceX, cfg.GlyphMaxAdvanceX);
            float char_off_x = font_off_x;
            if (char_advance_x_org != char_advance_x_mod)
                char_off_x += cfg.PixelSnapH ? (float)(int)((char_advance_x_mod - char_advance_x_org) * 0.5f) : (char_advance_x_mod - char_advance_x_org) * 0.5f;
            
            // Register glyph
            stbtt_aligned_quad q;
            float dummy_x = 0.0f, dummy_y = 0.0f;
            stbtt_GetPackedQuad(src_tmp.PackedChars, atlas->TexWidth, atlas->TexHeight, glyph_i, &dummy_x, &dummy_y, &q, 0);
            dst_font->AddGlyph((ImWchar)codepoint, q.x0 + char_off_x, q.y0 + font_off_y, q.x1 + char_off_x, q.y1 + font_off_y, q.s0, q.t0, q.s1, q.t1, char_advance_x_mod);
        }
    }

    // Cleanup temporary (ImVector doesn't honor destructor)
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
        src_tmp_array[src_i].~ImFontBuildSrcData();

    ImFontAtlasBuildFinish(atlas);
    return true;
}